

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  code *pcVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [28];
  ulong uVar84;
  RTCIntersectArguments *pRVar85;
  uint uVar86;
  ulong uVar87;
  uint uVar88;
  ulong uVar89;
  long lVar90;
  ulong uVar91;
  bool bVar92;
  undefined4 uVar93;
  undefined8 uVar94;
  float fVar110;
  vint4 bi_2;
  undefined1 auVar95 [16];
  float fVar108;
  float fVar112;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar109;
  float fVar111;
  float fVar113;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar99 [16];
  undefined1 auVar107 [32];
  float fVar117;
  float fVar133;
  vint4 bi_1;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar121 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar145 [32];
  undefined1 auVar139 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar149;
  float fVar153;
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vint4 ai;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 bi;
  undefined1 auVar172 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar194 [64];
  undefined4 uVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined8 uVar205;
  undefined8 uVar206;
  undefined8 uVar207;
  undefined1 auVar204 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_840 [4];
  undefined1 auStack_83c [8];
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_800 [32];
  undefined8 local_7c0;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 (*local_640) [16];
  Precalculations *local_638;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined1 local_570 [8];
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar91 = (ulong)(byte)PVar9;
  lVar73 = uVar91 * 0x19;
  auVar159 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar159 = vinsertps_avx(auVar159,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar135 = *(float *)(prim + lVar73 + 0x12);
  auVar159 = vsubps_avx(auVar159,*(undefined1 (*) [16])(prim + lVar73 + 6));
  auVar95._0_4_ = fVar135 * auVar159._0_4_;
  auVar95._4_4_ = fVar135 * auVar159._4_4_;
  auVar95._8_4_ = fVar135 * auVar159._8_4_;
  auVar95._12_4_ = fVar135 * auVar159._12_4_;
  auVar164._0_4_ = fVar135 * auVar14._0_4_;
  auVar164._4_4_ = fVar135 * auVar14._4_4_;
  auVar164._8_4_ = fVar135 * auVar14._8_4_;
  auVar164._12_4_ = fVar135 * auVar14._12_4_;
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar91 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar84 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + uVar91 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar84 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar211._4_4_ = auVar164._0_4_;
  auVar211._0_4_ = auVar164._0_4_;
  auVar211._8_4_ = auVar164._0_4_;
  auVar211._12_4_ = auVar164._0_4_;
  auVar119 = vshufps_avx(auVar164,auVar164,0x55);
  auVar96 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar135 = auVar96._0_4_;
  auVar199._0_4_ = fVar135 * auVar15._0_4_;
  fVar108 = auVar96._4_4_;
  auVar199._4_4_ = fVar108 * auVar15._4_4_;
  fVar110 = auVar96._8_4_;
  auVar199._8_4_ = fVar110 * auVar15._8_4_;
  fVar112 = auVar96._12_4_;
  auVar199._12_4_ = fVar112 * auVar15._12_4_;
  auVar193._0_4_ = auVar18._0_4_ * fVar135;
  auVar193._4_4_ = auVar18._4_4_ * fVar108;
  auVar193._8_4_ = auVar18._8_4_ * fVar110;
  auVar193._12_4_ = auVar18._12_4_ * fVar112;
  auVar181._0_4_ = auVar136._0_4_ * fVar135;
  auVar181._4_4_ = auVar136._4_4_ * fVar108;
  auVar181._8_4_ = auVar136._8_4_ * fVar110;
  auVar181._12_4_ = auVar136._12_4_ * fVar112;
  auVar96 = vfmadd231ps_fma(auVar199,auVar119,auVar14);
  auVar120 = vfmadd231ps_fma(auVar193,auVar119,auVar17);
  auVar119 = vfmadd231ps_fma(auVar181,auVar97,auVar119);
  auVar150 = vfmadd231ps_fma(auVar96,auVar211,auVar159);
  auVar202 = ZEXT1664(auVar150);
  auVar120 = vfmadd231ps_fma(auVar120,auVar211,auVar16);
  auVar155 = vfmadd231ps_fma(auVar119,auVar98,auVar211);
  auVar212._4_4_ = auVar95._0_4_;
  auVar212._0_4_ = auVar95._0_4_;
  auVar212._8_4_ = auVar95._0_4_;
  auVar212._12_4_ = auVar95._0_4_;
  auVar119 = vshufps_avx(auVar95,auVar95,0x55);
  auVar96 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar135 = auVar96._0_4_;
  auVar165._0_4_ = fVar135 * auVar15._0_4_;
  fVar108 = auVar96._4_4_;
  auVar165._4_4_ = fVar108 * auVar15._4_4_;
  fVar110 = auVar96._8_4_;
  auVar165._8_4_ = fVar110 * auVar15._8_4_;
  fVar112 = auVar96._12_4_;
  auVar165._12_4_ = fVar112 * auVar15._12_4_;
  auVar118._0_4_ = auVar18._0_4_ * fVar135;
  auVar118._4_4_ = auVar18._4_4_ * fVar108;
  auVar118._8_4_ = auVar18._8_4_ * fVar110;
  auVar118._12_4_ = auVar18._12_4_ * fVar112;
  auVar96._0_4_ = auVar136._0_4_ * fVar135;
  auVar96._4_4_ = auVar136._4_4_ * fVar108;
  auVar96._8_4_ = auVar136._8_4_ * fVar110;
  auVar96._12_4_ = auVar136._12_4_ * fVar112;
  auVar14 = vfmadd231ps_fma(auVar165,auVar119,auVar14);
  auVar15 = vfmadd231ps_fma(auVar118,auVar119,auVar17);
  auVar17 = vfmadd231ps_fma(auVar96,auVar119,auVar97);
  auVar18 = vfmadd231ps_fma(auVar14,auVar212,auVar159);
  auVar97 = vfmadd231ps_fma(auVar15,auVar212,auVar16);
  auVar136 = vfmadd231ps_fma(auVar17,auVar212,auVar98);
  local_2f0._8_4_ = 0x7fffffff;
  local_2f0._0_8_ = 0x7fffffff7fffffff;
  local_2f0._12_4_ = 0x7fffffff;
  auVar159 = vandps_avx(auVar150,local_2f0);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  auVar159 = vcmpps_avx(auVar159,auVar154,1);
  auVar14 = vblendvps_avx(auVar150,auVar154,auVar159);
  auVar159 = vandps_avx(auVar120,local_2f0);
  auVar159 = vcmpps_avx(auVar159,auVar154,1);
  auVar15 = vblendvps_avx(auVar120,auVar154,auVar159);
  auVar159 = vandps_avx(auVar155,local_2f0);
  auVar159 = vcmpps_avx(auVar159,auVar154,1);
  auVar159 = vblendvps_avx(auVar155,auVar154,auVar159);
  auVar16 = vrcpps_avx(auVar14);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = &DAT_3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar16,auVar176);
  auVar16 = vfmadd132ps_fma(auVar14,auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar14,auVar176);
  auVar17 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar159);
  auVar15 = vfnmadd213ps_fma(auVar159,auVar14,auVar176);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar159 = vpmovsxwd_avx(auVar159);
  auVar98 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar18);
  auVar155._0_4_ = auVar16._0_4_ * auVar159._0_4_;
  auVar155._4_4_ = auVar16._4_4_ * auVar159._4_4_;
  auVar155._8_4_ = auVar16._8_4_ * auVar159._8_4_;
  auVar155._12_4_ = auVar16._12_4_ * auVar159._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar159 = vpmovsxwd_avx(auVar14);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar18);
  auVar166._0_4_ = auVar16._0_4_ * auVar159._0_4_;
  auVar166._4_4_ = auVar16._4_4_ * auVar159._4_4_;
  auVar166._8_4_ = auVar16._8_4_ * auVar159._8_4_;
  auVar166._12_4_ = auVar16._12_4_ * auVar159._12_4_;
  auVar120._1_3_ = 0;
  auVar120[0] = PVar9;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar91 * -2 + 6);
  auVar159 = vpmovsxwd_avx(auVar16);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar97);
  auVar182._0_4_ = auVar159._0_4_ * auVar17._0_4_;
  auVar182._4_4_ = auVar159._4_4_ * auVar17._4_4_;
  auVar182._8_4_ = auVar159._8_4_ * auVar17._8_4_;
  auVar182._12_4_ = auVar159._12_4_ * auVar17._12_4_;
  auVar159 = vcvtdq2ps_avx(auVar14);
  auVar159 = vsubps_avx(auVar159,auVar97);
  auVar119._0_4_ = auVar17._0_4_ * auVar159._0_4_;
  auVar119._4_4_ = auVar17._4_4_ * auVar159._4_4_;
  auVar119._8_4_ = auVar17._8_4_ * auVar159._8_4_;
  auVar119._12_4_ = auVar17._12_4_ * auVar159._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar84 + uVar91 + 6);
  auVar159 = vpmovsxwd_avx(auVar17);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar136);
  auVar150._0_4_ = auVar98._0_4_ * auVar159._0_4_;
  auVar150._4_4_ = auVar98._4_4_ * auVar159._4_4_;
  auVar150._8_4_ = auVar98._8_4_ * auVar159._8_4_;
  auVar150._12_4_ = auVar98._12_4_ * auVar159._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar159 = vpmovsxwd_avx(auVar18);
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar159 = vsubps_avx(auVar159,auVar136);
  auVar97._0_4_ = auVar98._0_4_ * auVar159._0_4_;
  auVar97._4_4_ = auVar98._4_4_ * auVar159._4_4_;
  auVar97._8_4_ = auVar98._8_4_ * auVar159._8_4_;
  auVar97._12_4_ = auVar98._12_4_ * auVar159._12_4_;
  auVar159 = vpminsd_avx(auVar155,auVar166);
  auVar14 = vpminsd_avx(auVar182,auVar119);
  auVar159 = vmaxps_avx(auVar159,auVar14);
  auVar14 = vpminsd_avx(auVar150,auVar97);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar185._4_4_ = uVar93;
  auVar185._0_4_ = uVar93;
  auVar185._8_4_ = uVar93;
  auVar185._12_4_ = uVar93;
  auVar14 = vmaxps_avx(auVar14,auVar185);
  auVar159 = vmaxps_avx(auVar159,auVar14);
  local_300._0_4_ = auVar159._0_4_ * 0.99999964;
  local_300._4_4_ = auVar159._4_4_ * 0.99999964;
  local_300._8_4_ = auVar159._8_4_ * 0.99999964;
  local_300._12_4_ = auVar159._12_4_ * 0.99999964;
  auVar159 = vpmaxsd_avx(auVar155,auVar166);
  auVar14 = vpmaxsd_avx(auVar182,auVar119);
  auVar159 = vminps_avx(auVar159,auVar14);
  auVar14 = vpmaxsd_avx(auVar150,auVar97);
  uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = uVar93;
  auVar136._0_4_ = uVar93;
  auVar136._8_4_ = uVar93;
  auVar136._12_4_ = uVar93;
  auVar14 = vminps_avx(auVar14,auVar136);
  auVar159 = vminps_avx(auVar159,auVar14);
  auVar98._0_4_ = auVar159._0_4_ * 1.0000004;
  auVar98._4_4_ = auVar159._4_4_ * 1.0000004;
  auVar98._8_4_ = auVar159._8_4_ * 1.0000004;
  auVar98._12_4_ = auVar159._12_4_ * 1.0000004;
  auVar120[4] = PVar9;
  auVar120._5_3_ = 0;
  auVar120[8] = PVar9;
  auVar120._9_3_ = 0;
  auVar120[0xc] = PVar9;
  auVar120._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar120,_DAT_01ff0cf0);
  auVar159 = vcmpps_avx(local_300,auVar98,2);
  auVar159 = vandps_avx(auVar159,auVar14);
  uVar86 = vmovmskps_avx(auVar159);
  bVar92 = uVar86 != 0;
  if (bVar92) {
    uVar86 = uVar86 & 0xff;
    local_4a0 = mm_lookupmask_ps._16_8_;
    uStack_498 = mm_lookupmask_ps._24_8_;
    uStack_490 = mm_lookupmask_ps._16_8_;
    uStack_488 = mm_lookupmask_ps._24_8_;
    local_640 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_638 = pre;
    do {
      auVar129 = auVar202._0_32_;
      lVar22 = 0;
      uVar91 = (ulong)uVar86;
      for (uVar84 = uVar91; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar91 = uVar91 - 1 & uVar91;
      local_580 = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar84 = (ulong)(uint)((int)lVar22 << 6);
      uVar86 = *(uint *)(prim + 2);
      local_788 = (ulong)uVar86;
      pGVar11 = (context->scene->geometries).items[local_788].ptr;
      pPVar1 = prim + uVar84 + lVar73 + 0x16;
      local_710 = *(undefined8 *)pPVar1;
      uStack_708 = *(undefined8 *)(pPVar1 + 8);
      if (uVar91 != 0) {
        uVar87 = uVar91 - 1 & uVar91;
        for (uVar89 = uVar91; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
        if (uVar87 != 0) {
          for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_4b0 = *(undefined1 (*) [16])(prim + uVar84 + lVar73 + 0x26);
      local_4c0 = *(undefined1 (*) [16])(prim + uVar84 + lVar73 + 0x36);
      local_4d0 = *(undefined1 (*) [16])(prim + uVar84 + lVar73 + 0x46);
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar159 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar16 = vinsertps_avx(auVar159,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar14 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar16);
      uVar93 = auVar14._0_4_;
      auVar156._4_4_ = uVar93;
      auVar156._0_4_ = uVar93;
      auVar156._8_4_ = uVar93;
      auVar156._12_4_ = uVar93;
      auVar159 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar135 = pre->ray_space[k].vz.field_0.m128[0];
      fVar108 = pre->ray_space[k].vz.field_0.m128[1];
      fVar110 = pre->ray_space[k].vz.field_0.m128[2];
      fVar112 = pre->ray_space[k].vz.field_0.m128[3];
      auVar170._0_4_ = fVar135 * auVar14._0_4_;
      auVar170._4_4_ = fVar108 * auVar14._4_4_;
      auVar170._8_4_ = fVar110 * auVar14._8_4_;
      auVar170._12_4_ = fVar112 * auVar14._12_4_;
      auVar159 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar6,auVar159);
      auVar18 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar5,auVar156);
      auVar159 = vblendps_avx(auVar18,*(undefined1 (*) [16])pPVar1,8);
      auVar15 = vsubps_avx(local_4b0,auVar16);
      uVar93 = auVar15._0_4_;
      auVar171._4_4_ = uVar93;
      auVar171._0_4_ = uVar93;
      auVar171._8_4_ = uVar93;
      auVar171._12_4_ = uVar93;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar186._0_4_ = fVar135 * auVar15._0_4_;
      auVar186._4_4_ = fVar108 * auVar15._4_4_;
      auVar186._8_4_ = fVar110 * auVar15._8_4_;
      auVar186._12_4_ = fVar112 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar14);
      auVar98 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar171);
      auVar14 = vblendps_avx(auVar98,local_4b0,8);
      auVar17 = vsubps_avx(local_4c0,auVar16);
      uVar93 = auVar17._0_4_;
      auVar177._4_4_ = uVar93;
      auVar177._0_4_ = uVar93;
      auVar177._8_4_ = uVar93;
      auVar177._12_4_ = uVar93;
      auVar15 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar200._0_4_ = fVar135 * auVar17._0_4_;
      auVar200._4_4_ = fVar108 * auVar17._4_4_;
      auVar200._8_4_ = fVar110 * auVar17._8_4_;
      auVar200._12_4_ = fVar112 * auVar17._12_4_;
      auVar15 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar15);
      auVar97 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar177);
      auVar15 = vblendps_avx(auVar97,local_4c0,8);
      auVar17 = vsubps_avx(local_4d0,auVar16);
      uVar93 = auVar17._0_4_;
      auVar178._4_4_ = uVar93;
      auVar178._0_4_ = uVar93;
      auVar178._8_4_ = uVar93;
      auVar178._12_4_ = uVar93;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar203._0_4_ = fVar135 * auVar17._0_4_;
      auVar203._4_4_ = fVar108 * auVar17._4_4_;
      auVar203._8_4_ = fVar110 * auVar17._8_4_;
      auVar203._12_4_ = fVar112 * auVar17._12_4_;
      auVar16 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar16);
      auVar136 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar178);
      auVar16 = vblendps_avx(auVar136,local_4d0,8);
      auVar159 = vandps_avx(auVar159,local_2f0);
      auVar14 = vandps_avx(auVar14,local_2f0);
      auVar17 = vmaxps_avx(auVar159,auVar14);
      auVar159 = vandps_avx(auVar15,local_2f0);
      auVar14 = vandps_avx(auVar16,local_2f0);
      auVar159 = vmaxps_avx(auVar159,auVar14);
      auVar159 = vmaxps_avx(auVar17,auVar159);
      auVar14 = vmovshdup_avx(auVar159);
      auVar14 = vmaxss_avx(auVar14,auVar159);
      auVar159 = vshufpd_avx(auVar159,auVar159,1);
      auVar159 = vmaxss_avx(auVar159,auVar14);
      lVar22 = (long)iVar10 * 0x44;
      auVar14 = vmovshdup_avx(auVar18);
      uVar94 = auVar14._0_8_;
      local_420._8_8_ = uVar94;
      local_420._0_8_ = uVar94;
      local_420._16_8_ = uVar94;
      local_420._24_8_ = uVar94;
      auVar14 = vmovshdup_avx(auVar98);
      uVar94 = auVar14._0_8_;
      local_6e0._8_8_ = uVar94;
      local_6e0._0_8_ = uVar94;
      local_6e0._16_8_ = uVar94;
      local_6e0._24_8_ = uVar94;
      auVar7 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      local_6a0._0_16_ = auVar97;
      uVar198 = auVar97._0_4_;
      local_6c0._4_4_ = uVar198;
      local_6c0._0_4_ = uVar198;
      local_6c0._8_4_ = uVar198;
      local_6c0._12_4_ = uVar198;
      local_6c0._16_4_ = uVar198;
      local_6c0._20_4_ = uVar198;
      local_6c0._24_4_ = uVar198;
      local_6c0._28_4_ = uVar198;
      auVar14 = vmovshdup_avx(auVar97);
      uVar94 = auVar14._0_8_;
      local_5a0._8_8_ = uVar94;
      local_5a0._0_8_ = uVar94;
      local_5a0._16_8_ = uVar94;
      local_5a0._24_8_ = uVar94;
      fVar135 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      auVar83 = *(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      local_660 = auVar136._0_4_;
      auVar14 = vmovshdup_avx(auVar136);
      local_740 = auVar14._0_8_;
      auVar107._4_4_ = local_660 * *(float *)(bspline_basis0 + lVar22 + 0xd90);
      auVar107._0_4_ = local_660 * fVar135;
      auVar107._8_4_ = local_660 * *(float *)(bspline_basis0 + lVar22 + 0xd94);
      auVar107._12_4_ = local_660 * *(float *)(bspline_basis0 + lVar22 + 0xd98);
      auVar107._16_4_ = local_660 * *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      auVar107._20_4_ = local_660 * *(float *)(bspline_basis0 + lVar22 + 0xda0);
      auVar107._24_4_ = local_660 * *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar107._28_4_ = *(undefined4 *)(bspline_basis0 + lVar22 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar107,auVar7,local_6c0);
      fVar149 = auVar14._0_4_;
      auVar128._0_4_ = fVar149 * fVar135;
      fVar153 = auVar14._4_4_;
      auVar128._4_4_ = fVar153 * *(float *)(bspline_basis0 + lVar22 + 0xd90);
      auVar128._8_4_ = fVar149 * *(float *)(bspline_basis0 + lVar22 + 0xd94);
      auVar128._12_4_ = fVar153 * *(float *)(bspline_basis0 + lVar22 + 0xd98);
      auVar128._16_4_ = fVar149 * *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      auVar128._20_4_ = fVar153 * *(float *)(bspline_basis0 + lVar22 + 0xda0);
      auVar128._24_4_ = fVar149 * *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar128._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar128,auVar7,local_5a0);
      auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      uVar93 = auVar98._0_4_;
      local_760._4_4_ = uVar93;
      local_760._0_4_ = uVar93;
      local_760._8_4_ = uVar93;
      local_760._12_4_ = uVar93;
      local_760._16_4_ = uVar93;
      local_760._20_4_ = uVar93;
      local_760._24_4_ = uVar93;
      local_760._28_4_ = uVar93;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar107,local_760);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar107,local_6e0);
      auVar128 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      local_440._0_4_ = auVar18._0_4_;
      local_780._4_4_ = local_440._0_4_;
      local_780._0_4_ = local_440._0_4_;
      local_780._8_4_ = local_440._0_4_;
      local_780._12_4_ = local_440._0_4_;
      local_780._16_4_ = local_440._0_4_;
      local_780._20_4_ = local_440._0_4_;
      local_780._24_4_ = local_440._0_4_;
      local_780._28_4_ = local_440._0_4_;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar128,local_780);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar128,local_420);
      local_320 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      auVar174 = ZEXT3264(local_320);
      fVar109 = *(float *)(bspline_basis1 + lVar22 + 0xd8c);
      fVar111 = *(float *)(bspline_basis1 + lVar22 + 0xd90);
      fVar113 = *(float *)(bspline_basis1 + lVar22 + 0xd94);
      fVar114 = *(float *)(bspline_basis1 + lVar22 + 0xd98);
      fVar115 = *(float *)(bspline_basis1 + lVar22 + 0xd9c);
      fVar116 = *(float *)(bspline_basis1 + lVar22 + 0xda0);
      fVar197 = *(float *)(bspline_basis1 + lVar22 + 0xda4);
      auVar191._4_4_ = fVar111 * local_660;
      auVar191._0_4_ = fVar109 * local_660;
      auVar191._8_4_ = fVar113 * local_660;
      auVar191._12_4_ = fVar114 * local_660;
      auVar191._16_4_ = fVar115 * local_660;
      auVar191._20_4_ = fVar116 * local_660;
      auVar191._24_4_ = fVar197 * local_660;
      auVar191._28_4_ = *(undefined4 *)(bspline_basis0 + lVar22 + 0xda8);
      auVar16 = vfmadd231ps_fma(auVar191,local_320,local_6c0);
      auVar8._4_4_ = fVar111 * fVar153;
      auVar8._0_4_ = fVar109 * fVar149;
      auVar8._8_4_ = fVar113 * fVar149;
      auVar8._12_4_ = fVar114 * fVar153;
      auVar8._16_4_ = fVar115 * fVar149;
      auVar8._20_4_ = fVar116 * fVar153;
      auVar8._24_4_ = fVar197 * fVar149;
      auVar8._28_4_ = uVar198;
      auVar17 = vfmadd231ps_fma(auVar8,local_320,local_5a0);
      auVar191 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,local_760);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,local_6e0);
      auVar8 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar8,local_780);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar8,local_420);
      auVar100 = ZEXT1632(auVar16);
      auVar123 = ZEXT1632(auVar15);
      auVar19 = vsubps_avx(auVar100,auVar123);
      auVar143 = ZEXT1632(auVar17);
      auVar208 = ZEXT1632(auVar14);
      auVar20 = vsubps_avx(auVar143,auVar208);
      auVar101._0_4_ = auVar14._0_4_ * auVar19._0_4_;
      auVar101._4_4_ = auVar14._4_4_ * auVar19._4_4_;
      auVar101._8_4_ = auVar14._8_4_ * auVar19._8_4_;
      auVar101._12_4_ = auVar14._12_4_ * auVar19._12_4_;
      auVar101._16_4_ = auVar19._16_4_ * 0.0;
      auVar101._20_4_ = auVar19._20_4_ * 0.0;
      auVar101._24_4_ = auVar19._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      fVar135 = auVar20._0_4_;
      auVar124._0_4_ = auVar15._0_4_ * fVar135;
      fVar108 = auVar20._4_4_;
      auVar124._4_4_ = auVar15._4_4_ * fVar108;
      fVar110 = auVar20._8_4_;
      auVar124._8_4_ = auVar15._8_4_ * fVar110;
      fVar112 = auVar20._12_4_;
      auVar124._12_4_ = auVar15._12_4_ * fVar112;
      fVar195 = auVar20._16_4_;
      auVar124._16_4_ = fVar195 * 0.0;
      fVar196 = auVar20._20_4_;
      auVar124._20_4_ = fVar196 * 0.0;
      fVar134 = auVar20._24_4_;
      auVar124._24_4_ = fVar134 * 0.0;
      auVar124._28_4_ = 0;
      auVar101 = vsubps_avx(auVar101,auVar124);
      auVar14 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar94 = auVar14._0_8_;
      local_80._8_8_ = uVar94;
      local_80._0_8_ = uVar94;
      local_80._16_8_ = uVar94;
      local_80._24_8_ = uVar94;
      auVar15 = vpermilps_avx(local_4b0,0xff);
      uVar94 = auVar15._0_8_;
      local_a0._8_8_ = uVar94;
      local_a0._0_8_ = uVar94;
      local_a0._16_8_ = uVar94;
      local_a0._24_8_ = uVar94;
      auVar15 = vpermilps_avx(local_4c0,0xff);
      uVar94 = auVar15._0_8_;
      local_c0._8_8_ = uVar94;
      local_c0._0_8_ = uVar94;
      local_c0._16_8_ = uVar94;
      local_c0._24_8_ = uVar94;
      auVar15 = vpermilps_avx(local_4d0,0xff);
      local_e0 = auVar15._0_8_;
      local_840 = auVar83._0_4_;
      auStack_83c._0_4_ = auVar83._4_4_;
      auStack_83c._4_4_ = auVar83._8_4_;
      fStack_834 = auVar83._12_4_;
      fStack_830 = auVar83._16_4_;
      fStack_82c = auVar83._20_4_;
      fStack_828 = auVar83._24_4_;
      fVar117 = auVar15._0_4_;
      fVar133 = auVar15._4_4_;
      auVar146._4_4_ = fVar133 * (float)auStack_83c._0_4_;
      auVar146._0_4_ = fVar117 * (float)local_840;
      auVar146._8_4_ = fVar117 * (float)auStack_83c._4_4_;
      auVar146._12_4_ = fVar133 * fStack_834;
      auVar146._16_4_ = fVar117 * fStack_830;
      auVar146._20_4_ = fVar133 * fStack_82c;
      auVar146._24_4_ = fVar117 * fStack_828;
      auVar146._28_4_ = local_440._0_4_;
      auVar15 = vfmadd231ps_fma(auVar146,local_c0,auVar7);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar107,local_a0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar128,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar21._4_4_ = fVar111 * fVar133;
      auVar21._0_4_ = fVar109 * fVar117;
      auVar21._8_4_ = fVar113 * fVar117;
      auVar21._12_4_ = fVar114 * fVar133;
      auVar21._16_4_ = fVar115 * fVar117;
      auVar21._20_4_ = fVar116 * fVar133;
      auVar21._24_4_ = fVar197 * fVar117;
      auVar21._28_4_ = auVar128._28_4_;
      auVar16 = vfmadd231ps_fma(auVar21,local_320,local_c0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,local_a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar8,local_80);
      auVar130._4_4_ = fVar108 * fVar108;
      auVar130._0_4_ = fVar135 * fVar135;
      auVar130._8_4_ = fVar110 * fVar110;
      auVar130._12_4_ = fVar112 * fVar112;
      auVar130._16_4_ = fVar195 * fVar195;
      auVar130._20_4_ = fVar196 * fVar196;
      auVar130._24_4_ = fVar134 * fVar134;
      auVar130._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar130,auVar19,auVar19);
      auVar146 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar172._4_4_ = auVar146._4_4_ * auVar146._4_4_ * auVar14._4_4_;
      auVar172._0_4_ = auVar146._0_4_ * auVar146._0_4_ * auVar14._0_4_;
      auVar172._8_4_ = auVar146._8_4_ * auVar146._8_4_ * auVar14._8_4_;
      auVar172._12_4_ = auVar146._12_4_ * auVar146._12_4_ * auVar14._12_4_;
      auVar172._16_4_ = auVar146._16_4_ * auVar146._16_4_ * 0.0;
      auVar172._20_4_ = auVar146._20_4_ * auVar146._20_4_ * 0.0;
      auVar172._24_4_ = auVar146._24_4_ * auVar146._24_4_ * 0.0;
      auVar172._28_4_ = auVar146._28_4_;
      auVar187._4_4_ = auVar101._4_4_ * auVar101._4_4_;
      auVar187._0_4_ = auVar101._0_4_ * auVar101._0_4_;
      auVar187._8_4_ = auVar101._8_4_ * auVar101._8_4_;
      auVar187._12_4_ = auVar101._12_4_ * auVar101._12_4_;
      auVar187._16_4_ = auVar101._16_4_ * auVar101._16_4_;
      auVar187._20_4_ = auVar101._20_4_ * auVar101._20_4_;
      auVar187._24_4_ = auVar101._24_4_ * auVar101._24_4_;
      auVar187._28_4_ = auVar101._28_4_;
      auVar146 = vcmpps_avx(auVar187,auVar172,2);
      auVar148 = ZEXT3264(auVar146);
      fVar135 = auVar159._0_4_ * 4.7683716e-07;
      auVar102._0_4_ = (float)iVar10;
      register0x00001504 = auVar136._4_12_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar102._16_4_ = auVar102._0_4_;
      auVar102._20_4_ = auVar102._0_4_;
      auVar102._24_4_ = auVar102._0_4_;
      auVar102._28_4_ = auVar102._0_4_;
      auVar101 = vcmpps_avx(_DAT_02020f40,auVar102,1);
      auVar14 = vpermilps_avx(auVar18,0xaa);
      uVar94 = auVar14._0_8_;
      local_600._8_8_ = uVar94;
      local_600._0_8_ = uVar94;
      local_600._16_8_ = uVar94;
      local_600._24_8_ = uVar94;
      auVar209 = ZEXT3264(local_600);
      auVar159 = vpermilps_avx(auVar98,0xaa);
      uVar94 = auVar159._0_8_;
      local_140._8_8_ = uVar94;
      local_140._0_8_ = uVar94;
      local_140._16_8_ = uVar94;
      local_140._24_8_ = uVar94;
      auVar159 = vpermilps_avx(auVar97,0xaa);
      uVar94 = auVar159._0_8_;
      local_440._8_8_ = uVar94;
      local_440._0_8_ = uVar94;
      local_440._16_8_ = uVar94;
      local_440._24_8_ = uVar94;
      auVar159 = vshufps_avx(auVar136,auVar136,0xaa);
      uVar94 = auVar159._0_8_;
      auVar21 = auVar101 & auVar146;
      uVar88 = *(uint *)(ray + k * 4 + 0x30);
      local_5c0._0_16_ = ZEXT416(uVar88);
      fVar108 = fVar149;
      fVar110 = fVar153;
      fVar112 = fVar149;
      fVar195 = fVar153;
      fVar196 = fVar149;
      uVar205 = uVar94;
      uStack_670 = uVar94;
      uStack_668 = uVar94;
      uStack_738 = local_740;
      uStack_730 = local_740;
      uStack_728 = local_740;
      fStack_65c = local_660;
      fStack_658 = local_660;
      fStack_654 = local_660;
      fStack_650 = local_660;
      fStack_64c = local_660;
      fStack_648 = local_660;
      fStack_644 = local_660;
      local_570._0_4_ = auVar102._0_4_;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        pRVar85 = (RTCIntersectArguments *)0x0;
        auVar202 = ZEXT3264(auVar129);
        auVar132 = ZEXT3264(local_6e0);
        auVar215 = ZEXT3264(local_6c0);
        auVar192 = ZEXT3264(local_5a0);
        auVar179 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
        auVar194 = ZEXT3264(local_760);
        auVar216 = ZEXT3264(local_780);
      }
      else {
        local_480 = SUB84(pGVar11,0);
        fStack_47c = (float)((ulong)pGVar11 >> 0x20);
        local_6a0 = vandps_avx(auVar146,auVar101);
        fVar117 = auVar159._0_4_;
        fVar133 = auVar159._4_4_;
        auVar213._4_4_ = fVar133 * fVar111;
        auVar213._0_4_ = fVar117 * fVar109;
        auVar213._8_4_ = fVar117 * fVar113;
        auVar213._12_4_ = fVar133 * fVar114;
        auVar213._16_4_ = fVar117 * fVar115;
        auVar213._20_4_ = fVar133 * fVar116;
        auVar213._24_4_ = fVar117 * fVar197;
        auVar213._28_4_ = local_6a0._28_4_;
        auVar159 = vfmadd213ps_fma(local_320,local_440,auVar213);
        auVar159 = vfmadd213ps_fma(auVar191,local_140,ZEXT1632(auVar159));
        auVar159 = vfmadd213ps_fma(auVar8,local_600,ZEXT1632(auVar159));
        auVar103._0_4_ = fVar117 * (float)local_840;
        auVar103._4_4_ = fVar133 * (float)auStack_83c._0_4_;
        auVar103._8_4_ = fVar117 * (float)auStack_83c._4_4_;
        auVar103._12_4_ = fVar133 * fStack_834;
        auVar103._16_4_ = fVar117 * fStack_830;
        auVar103._20_4_ = fVar133 * fStack_82c;
        auVar103._24_4_ = fVar117 * fStack_828;
        auVar103._28_4_ = 0;
        auVar17 = vfmadd213ps_fma(auVar7,local_440,auVar103);
        auVar17 = vfmadd213ps_fma(auVar107,local_140,ZEXT1632(auVar17));
        auVar7 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar107 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar191 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        fVar134 = *(float *)(bspline_basis0 + lVar22 + 0x1f9c);
        fVar109 = *(float *)(bspline_basis0 + lVar22 + 0x1fa0);
        fVar111 = *(float *)(bspline_basis0 + lVar22 + 0x1fa4);
        fVar113 = *(float *)(bspline_basis0 + lVar22 + 0x1fa8);
        fVar114 = *(float *)(bspline_basis0 + lVar22 + 0x1fac);
        fVar115 = *(float *)(bspline_basis0 + lVar22 + 0x1fb0);
        fVar116 = *(float *)(bspline_basis0 + lVar22 + 0x1fb4);
        auVar24._4_4_ = local_660 * fVar109;
        auVar24._0_4_ = local_660 * fVar134;
        auVar24._8_4_ = local_660 * fVar111;
        auVar24._12_4_ = local_660 * fVar113;
        auVar24._16_4_ = local_660 * fVar114;
        auVar24._20_4_ = local_660 * fVar115;
        auVar24._24_4_ = local_660 * fVar116;
        auVar24._28_4_ = auVar20._28_4_;
        auVar25._4_4_ = fVar153 * fVar109;
        auVar25._0_4_ = fVar149 * fVar134;
        auVar25._8_4_ = fVar149 * fVar111;
        auVar25._12_4_ = fVar153 * fVar113;
        auVar25._16_4_ = fVar149 * fVar114;
        auVar25._20_4_ = fVar153 * fVar115;
        auVar25._24_4_ = fVar149 * fVar116;
        auVar25._28_4_ = *(undefined4 *)(bspline_basis1 + lVar22 + 0xda8);
        auVar26._4_4_ = fVar109 * fVar133;
        auVar26._0_4_ = fVar134 * fVar117;
        auVar26._8_4_ = fVar111 * fVar117;
        auVar26._12_4_ = fVar113 * fVar133;
        auVar26._16_4_ = fVar114 * fVar117;
        auVar26._20_4_ = fVar115 * fVar133;
        auVar26._24_4_ = fVar116 * fVar117;
        auVar26._28_4_ = auVar19._28_4_;
        auVar18 = vfmadd231ps_fma(auVar24,auVar191,local_6c0);
        auVar98 = vfmadd231ps_fma(auVar25,auVar191,local_5a0);
        auVar97 = vfmadd231ps_fma(auVar26,local_440,auVar191);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar107,local_760);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar107,local_6e0);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_140,auVar107);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar7,local_780);
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar7,local_420);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_600,auVar7);
        fVar134 = *(float *)(bspline_basis1 + lVar22 + 0x1f9c);
        fVar109 = *(float *)(bspline_basis1 + lVar22 + 0x1fa0);
        fVar111 = *(float *)(bspline_basis1 + lVar22 + 0x1fa4);
        fVar113 = *(float *)(bspline_basis1 + lVar22 + 0x1fa8);
        fVar114 = *(float *)(bspline_basis1 + lVar22 + 0x1fac);
        fVar115 = *(float *)(bspline_basis1 + lVar22 + 0x1fb0);
        fVar116 = *(float *)(bspline_basis1 + lVar22 + 0x1fb4);
        auVar27._4_4_ = local_660 * fVar109;
        auVar27._0_4_ = local_660 * fVar134;
        auVar27._8_4_ = local_660 * fVar111;
        auVar27._12_4_ = local_660 * fVar113;
        auVar27._16_4_ = local_660 * fVar114;
        auVar27._20_4_ = local_660 * fVar115;
        auVar27._24_4_ = local_660 * fVar116;
        auVar27._28_4_ = local_660;
        auVar28._4_4_ = fVar153 * fVar109;
        auVar28._0_4_ = fVar149 * fVar134;
        auVar28._8_4_ = fVar149 * fVar111;
        auVar28._12_4_ = fVar153 * fVar113;
        auVar28._16_4_ = fVar149 * fVar114;
        auVar28._20_4_ = fVar153 * fVar115;
        auVar28._24_4_ = fVar149 * fVar116;
        auVar28._28_4_ = fVar153;
        auVar29._4_4_ = fVar109 * fVar133;
        auVar29._0_4_ = fVar134 * fVar117;
        auVar29._8_4_ = fVar111 * fVar117;
        auVar29._12_4_ = fVar113 * fVar133;
        auVar29._16_4_ = fVar114 * fVar117;
        auVar29._20_4_ = fVar115 * fVar133;
        auVar29._24_4_ = fVar116 * fVar117;
        auVar29._28_4_ = auVar14._4_4_;
        auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar14 = vfmadd231ps_fma(auVar27,auVar7,local_6c0);
        auVar136 = vfmadd231ps_fma(auVar28,auVar7,local_5a0);
        auVar119 = vfmadd231ps_fma(auVar29,auVar7,local_440);
        auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar7,local_760);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar7,local_6e0);
        auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),local_140,auVar7);
        auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar7,local_780);
        auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar7,local_420);
        auVar125._8_4_ = 0x7fffffff;
        auVar125._0_8_ = 0x7fffffff7fffffff;
        auVar125._12_4_ = 0x7fffffff;
        auVar125._16_4_ = 0x7fffffff;
        auVar125._20_4_ = 0x7fffffff;
        auVar125._24_4_ = 0x7fffffff;
        auVar125._28_4_ = 0x7fffffff;
        auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),local_600,auVar7);
        auVar7 = vandps_avx(ZEXT1632(auVar18),auVar125);
        auVar107 = vandps_avx(ZEXT1632(auVar98),auVar125);
        auVar107 = vmaxps_avx(auVar7,auVar107);
        auVar7 = vandps_avx(ZEXT1632(auVar97),auVar125);
        auVar7 = vmaxps_avx(auVar107,auVar7);
        auVar144._4_4_ = fVar135;
        auVar144._0_4_ = fVar135;
        auVar144._8_4_ = fVar135;
        auVar144._12_4_ = fVar135;
        auVar144._16_4_ = fVar135;
        auVar144._20_4_ = fVar135;
        auVar144._24_4_ = fVar135;
        auVar144._28_4_ = fVar135;
        auVar7 = vcmpps_avx(auVar7,auVar144,1);
        auVar191 = vblendvps_avx(ZEXT1632(auVar18),auVar19,auVar7);
        auVar8 = vblendvps_avx(ZEXT1632(auVar98),auVar20,auVar7);
        auVar7 = vandps_avx(ZEXT1632(auVar14),auVar125);
        auVar107 = vandps_avx(ZEXT1632(auVar136),auVar125);
        auVar146 = vmaxps_avx(auVar7,auVar107);
        auVar7 = vandps_avx(ZEXT1632(auVar119),auVar125);
        auVar7 = vmaxps_avx(auVar146,auVar7);
        auVar101 = vcmpps_avx(auVar7,auVar144,1);
        auVar7 = vblendvps_avx(ZEXT1632(auVar14),auVar19,auVar101);
        auVar146 = vblendvps_avx(ZEXT1632(auVar136),auVar20,auVar101);
        auVar14 = vfmadd213ps_fma(auVar128,local_600,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(auVar191,auVar191,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar8,auVar8);
        auVar128 = vrsqrtps_avx(ZEXT1632(auVar17));
        fVar134 = auVar128._0_4_;
        fVar109 = auVar128._4_4_;
        fVar111 = auVar128._8_4_;
        fVar113 = auVar128._12_4_;
        fVar114 = auVar128._16_4_;
        fVar115 = auVar128._20_4_;
        fVar116 = auVar128._24_4_;
        auVar19._4_4_ = fVar109 * fVar109 * fVar109 * auVar17._4_4_ * -0.5;
        auVar19._0_4_ = fVar134 * fVar134 * fVar134 * auVar17._0_4_ * -0.5;
        auVar19._8_4_ = fVar111 * fVar111 * fVar111 * auVar17._8_4_ * -0.5;
        auVar19._12_4_ = fVar113 * fVar113 * fVar113 * auVar17._12_4_ * -0.5;
        auVar19._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
        auVar19._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar19._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar19._28_4_ = 0;
        auVar162._8_4_ = 0x3fc00000;
        auVar162._0_8_ = 0x3fc000003fc00000;
        auVar162._12_4_ = 0x3fc00000;
        auVar162._16_4_ = 0x3fc00000;
        auVar162._20_4_ = 0x3fc00000;
        auVar162._24_4_ = 0x3fc00000;
        auVar162._28_4_ = 0x3fc00000;
        auVar17 = vfmadd231ps_fma(auVar19,auVar162,auVar128);
        fVar134 = auVar17._0_4_;
        fVar109 = auVar17._4_4_;
        auVar30._4_4_ = auVar8._4_4_ * fVar109;
        auVar30._0_4_ = auVar8._0_4_ * fVar134;
        fVar111 = auVar17._8_4_;
        auVar30._8_4_ = auVar8._8_4_ * fVar111;
        fVar113 = auVar17._12_4_;
        auVar30._12_4_ = auVar8._12_4_ * fVar113;
        auVar30._16_4_ = auVar8._16_4_ * 0.0;
        auVar30._20_4_ = auVar8._20_4_ * 0.0;
        auVar30._24_4_ = auVar8._24_4_ * 0.0;
        auVar30._28_4_ = auVar128._28_4_;
        auVar31._4_4_ = -auVar191._4_4_ * fVar109;
        auVar31._0_4_ = -auVar191._0_4_ * fVar134;
        auVar31._8_4_ = -auVar191._8_4_ * fVar111;
        auVar31._12_4_ = -auVar191._12_4_ * fVar113;
        auVar31._16_4_ = -auVar191._16_4_ * 0.0;
        auVar31._20_4_ = -auVar191._20_4_ * 0.0;
        auVar31._24_4_ = -auVar191._24_4_ * 0.0;
        auVar31._28_4_ = auVar107._28_4_;
        auVar17 = vfmadd213ps_fma(auVar7,auVar7,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar146,auVar146);
        auVar107 = vrsqrtps_avx(ZEXT1632(auVar17));
        auVar32._28_4_ = auVar101._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(fVar113 * 0.0,
                                CONCAT48(fVar111 * 0.0,CONCAT44(fVar109 * 0.0,fVar134 * 0.0))));
        fVar134 = auVar107._0_4_;
        fVar109 = auVar107._4_4_;
        fVar111 = auVar107._8_4_;
        fVar113 = auVar107._12_4_;
        fVar114 = auVar107._16_4_;
        fVar115 = auVar107._20_4_;
        fVar116 = auVar107._24_4_;
        auVar33._4_4_ = fVar109 * fVar109 * fVar109 * auVar17._4_4_ * -0.5;
        auVar33._0_4_ = fVar134 * fVar134 * fVar134 * auVar17._0_4_ * -0.5;
        auVar33._8_4_ = fVar111 * fVar111 * fVar111 * auVar17._8_4_ * -0.5;
        auVar33._12_4_ = fVar113 * fVar113 * fVar113 * auVar17._12_4_ * -0.5;
        auVar33._16_4_ = fVar114 * fVar114 * fVar114 * -0.0;
        auVar33._20_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar33._24_4_ = fVar116 * fVar116 * fVar116 * -0.0;
        auVar33._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar33,auVar162,auVar107);
        fVar134 = auVar17._0_4_;
        fVar109 = auVar17._4_4_;
        auVar34._4_4_ = auVar146._4_4_ * fVar109;
        auVar34._0_4_ = auVar146._0_4_ * fVar134;
        fVar111 = auVar17._8_4_;
        auVar34._8_4_ = auVar146._8_4_ * fVar111;
        fVar113 = auVar17._12_4_;
        auVar34._12_4_ = auVar146._12_4_ * fVar113;
        auVar34._16_4_ = auVar146._16_4_ * 0.0;
        auVar34._20_4_ = auVar146._20_4_ * 0.0;
        auVar34._24_4_ = auVar146._24_4_ * 0.0;
        auVar34._28_4_ = 0;
        auVar35._4_4_ = -auVar7._4_4_ * fVar109;
        auVar35._0_4_ = -auVar7._0_4_ * fVar134;
        auVar35._8_4_ = -auVar7._8_4_ * fVar111;
        auVar35._12_4_ = -auVar7._12_4_ * fVar113;
        auVar35._16_4_ = -auVar7._16_4_ * 0.0;
        auVar35._20_4_ = -auVar7._20_4_ * 0.0;
        auVar35._24_4_ = -auVar7._24_4_ * 0.0;
        auVar35._28_4_ = auVar146._28_4_;
        auVar7._28_4_ = auVar107._28_4_;
        auVar7._0_28_ =
             ZEXT1628(CONCAT412(fVar113 * 0.0,
                                CONCAT48(fVar111 * 0.0,CONCAT44(fVar109 * 0.0,fVar134 * 0.0))));
        auVar17 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar15),auVar123);
        auVar107 = ZEXT1632(auVar15);
        auVar18 = vfmadd213ps_fma(auVar31,auVar107,auVar208);
        auVar98 = vfmadd213ps_fma(auVar32,auVar107,ZEXT1632(auVar14));
        auVar119 = vfnmadd213ps_fma(auVar30,auVar107,auVar123);
        auVar97 = vfmadd213ps_fma(auVar34,ZEXT1632(auVar16),auVar100);
        auVar96 = vfnmadd213ps_fma(auVar31,auVar107,auVar208);
        auVar107 = ZEXT1632(auVar16);
        auVar136 = vfmadd213ps_fma(auVar35,auVar107,auVar143);
        auVar213 = ZEXT1632(auVar15);
        auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar213,auVar32);
        auVar14 = vfmadd213ps_fma(auVar7,auVar107,ZEXT1632(auVar159));
        auVar120 = vfnmadd213ps_fma(auVar34,auVar107,auVar100);
        auVar150 = vfnmadd213ps_fma(auVar35,auVar107,auVar143);
        auVar95 = vfnmadd231ps_fma(ZEXT1632(auVar159),ZEXT1632(auVar16),auVar7);
        auVar7 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar96));
        auVar107 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar155));
        auVar100._4_4_ = auVar155._4_4_ * auVar7._4_4_;
        auVar100._0_4_ = auVar155._0_4_ * auVar7._0_4_;
        auVar100._8_4_ = auVar155._8_4_ * auVar7._8_4_;
        auVar100._12_4_ = auVar155._12_4_ * auVar7._12_4_;
        auVar100._16_4_ = auVar7._16_4_ * 0.0;
        auVar100._20_4_ = auVar7._20_4_ * 0.0;
        auVar100._24_4_ = auVar7._24_4_ * 0.0;
        auVar100._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar96),auVar107);
        auVar123._4_4_ = auVar119._4_4_ * auVar107._4_4_;
        auVar123._0_4_ = auVar119._0_4_ * auVar107._0_4_;
        auVar123._8_4_ = auVar119._8_4_ * auVar107._8_4_;
        auVar123._12_4_ = auVar119._12_4_ * auVar107._12_4_;
        auVar123._16_4_ = auVar107._16_4_ * 0.0;
        auVar123._20_4_ = auVar107._20_4_ * 0.0;
        auVar123._24_4_ = auVar107._24_4_ * 0.0;
        auVar123._28_4_ = auVar107._28_4_;
        auVar101 = ZEXT1632(auVar119);
        auVar107 = vsubps_avx(ZEXT1632(auVar97),auVar101);
        auVar159 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar155),auVar107);
        auVar143._4_4_ = auVar96._4_4_ * auVar107._4_4_;
        auVar143._0_4_ = auVar96._0_4_ * auVar107._0_4_;
        auVar143._8_4_ = auVar96._8_4_ * auVar107._8_4_;
        auVar143._12_4_ = auVar96._12_4_ * auVar107._12_4_;
        auVar143._16_4_ = auVar107._16_4_ * 0.0;
        auVar143._20_4_ = auVar107._20_4_ * 0.0;
        auVar143._24_4_ = auVar107._24_4_ * 0.0;
        auVar143._28_4_ = auVar107._28_4_;
        auVar119 = vfmsub231ps_fma(auVar143,auVar101,auVar7);
        auVar159 = vfmadd231ps_fma(ZEXT1632(auVar119),ZEXT832(0) << 0x20,ZEXT1632(auVar159));
        auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar130 = vcmpps_avx(ZEXT1632(auVar159),ZEXT832(0) << 0x20,2);
        auVar7 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar17),auVar130);
        auVar107 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar18),auVar130);
        auVar128 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar98),auVar130);
        auVar174 = ZEXT3264(auVar128);
        auVar191 = vblendvps_avx(auVar101,ZEXT1632(auVar97),auVar130);
        auVar8 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar136),auVar130);
        auVar146 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar14),auVar130);
        auVar101 = vblendvps_avx(ZEXT1632(auVar97),auVar101,auVar130);
        auVar19 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar96),auVar130);
        auVar159 = vpackssdw_avx(local_6a0._0_16_,local_6a0._16_16_);
        auVar21 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar155),auVar130);
        auVar172 = vsubps_avx(auVar101,auVar7);
        auVar19 = vsubps_avx(auVar19,auVar107);
        auVar187 = vsubps_avx(auVar21,auVar128);
        auVar100 = vsubps_avx(auVar7,auVar191);
        auVar123 = vsubps_avx(auVar107,auVar8);
        auVar124 = vsubps_avx(auVar128,auVar146);
        auVar208._4_4_ = auVar187._4_4_ * auVar7._4_4_;
        auVar208._0_4_ = auVar187._0_4_ * auVar7._0_4_;
        auVar208._8_4_ = auVar187._8_4_ * auVar7._8_4_;
        auVar208._12_4_ = auVar187._12_4_ * auVar7._12_4_;
        auVar208._16_4_ = auVar187._16_4_ * auVar7._16_4_;
        auVar208._20_4_ = auVar187._20_4_ * auVar7._20_4_;
        auVar208._24_4_ = auVar187._24_4_ * auVar7._24_4_;
        auVar208._28_4_ = auVar21._28_4_;
        auVar14 = vfmsub231ps_fma(auVar208,auVar128,auVar172);
        auVar36._4_4_ = auVar172._4_4_ * auVar107._4_4_;
        auVar36._0_4_ = auVar172._0_4_ * auVar107._0_4_;
        auVar36._8_4_ = auVar172._8_4_ * auVar107._8_4_;
        auVar36._12_4_ = auVar172._12_4_ * auVar107._12_4_;
        auVar36._16_4_ = auVar172._16_4_ * auVar107._16_4_;
        auVar36._20_4_ = auVar172._20_4_ * auVar107._20_4_;
        auVar36._24_4_ = auVar172._24_4_ * auVar107._24_4_;
        auVar36._28_4_ = auVar101._28_4_;
        auVar15 = vfmsub231ps_fma(auVar36,auVar7,auVar19);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar104._0_4_ = auVar19._0_4_ * auVar128._0_4_;
        auVar104._4_4_ = auVar19._4_4_ * auVar128._4_4_;
        auVar104._8_4_ = auVar19._8_4_ * auVar128._8_4_;
        auVar104._12_4_ = auVar19._12_4_ * auVar128._12_4_;
        auVar104._16_4_ = auVar19._16_4_ * auVar128._16_4_;
        auVar104._20_4_ = auVar19._20_4_ * auVar128._20_4_;
        auVar104._24_4_ = auVar19._24_4_ * auVar128._24_4_;
        auVar104._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar104,auVar107,auVar187);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar148 = ZEXT1664(auVar15);
        auVar105._0_4_ = auVar124._0_4_ * auVar191._0_4_;
        auVar105._4_4_ = auVar124._4_4_ * auVar191._4_4_;
        auVar105._8_4_ = auVar124._8_4_ * auVar191._8_4_;
        auVar105._12_4_ = auVar124._12_4_ * auVar191._12_4_;
        auVar105._16_4_ = auVar124._16_4_ * auVar191._16_4_;
        auVar105._20_4_ = auVar124._20_4_ * auVar191._20_4_;
        auVar105._24_4_ = auVar124._24_4_ * auVar191._24_4_;
        auVar105._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar105,auVar100,auVar146);
        auVar37._4_4_ = auVar123._4_4_ * auVar146._4_4_;
        auVar37._0_4_ = auVar123._0_4_ * auVar146._0_4_;
        auVar37._8_4_ = auVar123._8_4_ * auVar146._8_4_;
        auVar37._12_4_ = auVar123._12_4_ * auVar146._12_4_;
        auVar37._16_4_ = auVar123._16_4_ * auVar146._16_4_;
        auVar37._20_4_ = auVar123._20_4_ * auVar146._20_4_;
        auVar37._24_4_ = auVar123._24_4_ * auVar146._24_4_;
        auVar37._28_4_ = auVar146._28_4_;
        auVar17 = vfmsub231ps_fma(auVar37,auVar8,auVar124);
        auVar38._4_4_ = auVar100._4_4_ * auVar8._4_4_;
        auVar38._0_4_ = auVar100._0_4_ * auVar8._0_4_;
        auVar38._8_4_ = auVar100._8_4_ * auVar8._8_4_;
        auVar38._12_4_ = auVar100._12_4_ * auVar8._12_4_;
        auVar38._16_4_ = auVar100._16_4_ * auVar8._16_4_;
        auVar38._20_4_ = auVar100._20_4_ * auVar8._20_4_;
        auVar38._24_4_ = auVar100._24_4_ * auVar8._24_4_;
        auVar38._28_4_ = auVar8._28_4_;
        auVar18 = vfmsub231ps_fma(auVar38,auVar123,auVar191);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar191 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar17));
        auVar191 = vcmpps_avx(auVar191,ZEXT832(0) << 0x20,2);
        auVar14 = vpackssdw_avx(auVar191._0_16_,auVar191._16_16_);
        auVar159 = vpand_avx(auVar159,auVar14);
        auVar191 = vpmovsxwd_avx2(auVar159);
        if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar191 >> 0x7f,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar191 >> 0xbf,0) == '\0') &&
            (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar191[0x1f]) {
LAB_016768d6:
          auVar179 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar202 = ZEXT3264(auVar129);
        }
        else {
          auVar39._4_4_ = auVar19._4_4_ * auVar124._4_4_;
          auVar39._0_4_ = auVar19._0_4_ * auVar124._0_4_;
          auVar39._8_4_ = auVar19._8_4_ * auVar124._8_4_;
          auVar39._12_4_ = auVar19._12_4_ * auVar124._12_4_;
          auVar39._16_4_ = auVar19._16_4_ * auVar124._16_4_;
          auVar39._20_4_ = auVar19._20_4_ * auVar124._20_4_;
          auVar39._24_4_ = auVar19._24_4_ * auVar124._24_4_;
          auVar39._28_4_ = auVar191._28_4_;
          auVar97 = vfmsub231ps_fma(auVar39,auVar123,auVar187);
          auVar126._0_4_ = auVar100._0_4_ * auVar187._0_4_;
          auVar126._4_4_ = auVar100._4_4_ * auVar187._4_4_;
          auVar126._8_4_ = auVar100._8_4_ * auVar187._8_4_;
          auVar126._12_4_ = auVar100._12_4_ * auVar187._12_4_;
          auVar126._16_4_ = auVar100._16_4_ * auVar187._16_4_;
          auVar126._20_4_ = auVar100._20_4_ * auVar187._20_4_;
          auVar126._24_4_ = auVar100._24_4_ * auVar187._24_4_;
          auVar126._28_4_ = 0;
          auVar98 = vfmsub231ps_fma(auVar126,auVar172,auVar124);
          auVar40._4_4_ = auVar172._4_4_ * auVar123._4_4_;
          auVar40._0_4_ = auVar172._0_4_ * auVar123._0_4_;
          auVar40._8_4_ = auVar172._8_4_ * auVar123._8_4_;
          auVar40._12_4_ = auVar172._12_4_ * auVar123._12_4_;
          auVar40._16_4_ = auVar172._16_4_ * auVar123._16_4_;
          auVar40._20_4_ = auVar172._20_4_ * auVar123._20_4_;
          auVar40._24_4_ = auVar172._24_4_ * auVar123._24_4_;
          auVar40._28_4_ = auVar172._28_4_;
          auVar136 = vfmsub231ps_fma(auVar40,auVar100,auVar19);
          auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar98),ZEXT1632(auVar136));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar97),_DAT_02020f00);
          auVar191 = vrcpps_avx(ZEXT1632(auVar18));
          auVar201._8_4_ = 0x3f800000;
          auVar201._0_8_ = &DAT_3f8000003f800000;
          auVar201._12_4_ = 0x3f800000;
          auVar201._16_4_ = 0x3f800000;
          auVar201._20_4_ = 0x3f800000;
          auVar201._24_4_ = 0x3f800000;
          auVar201._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar191,ZEXT1632(auVar18),auVar201);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar191,auVar191);
          auVar41._4_4_ = auVar136._4_4_ * auVar128._4_4_;
          auVar41._0_4_ = auVar136._0_4_ * auVar128._0_4_;
          auVar41._8_4_ = auVar136._8_4_ * auVar128._8_4_;
          auVar41._12_4_ = auVar136._12_4_ * auVar128._12_4_;
          auVar41._16_4_ = auVar128._16_4_ * 0.0;
          auVar41._20_4_ = auVar128._20_4_ * 0.0;
          auVar41._24_4_ = auVar128._24_4_ * 0.0;
          auVar41._28_4_ = auVar128._28_4_;
          auVar98 = vfmadd231ps_fma(auVar41,auVar107,ZEXT1632(auVar98));
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT1632(auVar97),auVar7);
          auVar174 = ZEXT1664(auVar98);
          fVar134 = auVar14._0_4_;
          fVar109 = auVar14._4_4_;
          fVar111 = auVar14._8_4_;
          fVar113 = auVar14._12_4_;
          auVar42._28_4_ = auVar107._28_4_;
          auVar42._0_28_ =
               ZEXT1628(CONCAT412(fVar113 * auVar98._12_4_,
                                  CONCAT48(fVar111 * auVar98._8_4_,
                                           CONCAT44(fVar109 * auVar98._4_4_,fVar134 * auVar98._0_4_)
                                          )));
          auVar106._4_4_ = uVar88;
          auVar106._0_4_ = uVar88;
          auVar106._8_4_ = uVar88;
          auVar106._12_4_ = uVar88;
          auVar106._16_4_ = uVar88;
          auVar106._20_4_ = uVar88;
          auVar106._24_4_ = uVar88;
          auVar106._28_4_ = uVar88;
          uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar127._4_4_ = uVar93;
          auVar127._0_4_ = uVar93;
          auVar127._8_4_ = uVar93;
          auVar127._12_4_ = uVar93;
          auVar127._16_4_ = uVar93;
          auVar127._20_4_ = uVar93;
          auVar127._24_4_ = uVar93;
          auVar127._28_4_ = uVar93;
          auVar7 = vcmpps_avx(auVar106,auVar42,2);
          auVar107 = vcmpps_avx(auVar42,auVar127,2);
          auVar7 = vandps_avx(auVar107,auVar7);
          auVar14 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
          auVar159 = vpand_avx(auVar159,auVar14);
          auVar7 = vpmovsxwd_avx2(auVar159);
          if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar7 >> 0x7f,0) == '\0') &&
                (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar7 >> 0xbf,0) == '\0') &&
              (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar7[0x1f]) goto LAB_016768d6;
          auVar7 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
          auVar14 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
          auVar159 = vpand_avx(auVar159,auVar14);
          auVar7 = vpmovsxwd_avx2(auVar159);
          auVar174 = ZEXT3264(auVar7);
          auVar179 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar202 = ZEXT3264(auVar129);
          if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0x7f,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar7 >> 0xbf,0) != '\0') ||
              (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar7[0x1f] < '\0') {
            auVar107 = ZEXT1632(CONCAT412(fVar113 * auVar15._12_4_,
                                          CONCAT48(fVar111 * auVar15._8_4_,
                                                   CONCAT44(fVar109 * auVar15._4_4_,
                                                            fVar134 * auVar15._0_4_))));
            auVar128 = ZEXT1632(CONCAT412(fVar113 * auVar17._12_4_,
                                          CONCAT48(fVar111 * auVar17._8_4_,
                                                   CONCAT44(fVar109 * auVar17._4_4_,
                                                            fVar134 * auVar17._0_4_))));
            auVar163._8_4_ = 0x3f800000;
            auVar163._0_8_ = &DAT_3f8000003f800000;
            auVar163._12_4_ = 0x3f800000;
            auVar163._16_4_ = 0x3f800000;
            auVar163._20_4_ = 0x3f800000;
            auVar163._24_4_ = 0x3f800000;
            auVar163._28_4_ = 0x3f800000;
            auVar129 = vsubps_avx(auVar163,auVar107);
            auVar148 = ZEXT3264(auVar129);
            _local_160 = vblendvps_avx(auVar129,auVar107,auVar130);
            auVar129 = vsubps_avx(auVar163,auVar128);
            local_340 = vblendvps_avx(auVar129,auVar128,auVar130);
            auVar179 = ZEXT3264(auVar7);
            auVar202 = ZEXT3264(auVar42);
          }
        }
        auVar216 = ZEXT3264(local_780);
        auVar215 = ZEXT3264(local_6c0);
        auVar209 = ZEXT3264(local_600);
        auVar194 = ZEXT3264(local_760);
        auVar192 = ZEXT3264(local_5a0);
        auVar129 = auVar179._0_32_;
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0x7f,0) == '\0') &&
              (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar129 >> 0xbf,0) == '\0') &&
            (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar179[0x1f]) {
          pRVar85 = (RTCIntersectArguments *)0x0;
          auVar132 = ZEXT3264(local_6e0);
          auVar179 = ZEXT3264(CONCAT428(local_660,
                                        CONCAT424(local_660,
                                                  CONCAT420(local_660,
                                                            CONCAT416(local_660,
                                                                      CONCAT412(local_660,
                                                                                CONCAT48(local_660,
                                                                                         CONCAT44(
                                                  local_660,local_660))))))));
        }
        else {
          auVar7 = vsubps_avx(ZEXT1632(auVar16),auVar213);
          auVar159 = vfmadd213ps_fma(auVar7,_local_160,auVar213);
          fVar134 = *(float *)((long)local_638->ray_space + k * 4 + -0x10);
          auVar43._4_4_ = (auVar159._4_4_ + auVar159._4_4_) * fVar134;
          auVar43._0_4_ = (auVar159._0_4_ + auVar159._0_4_) * fVar134;
          auVar43._8_4_ = (auVar159._8_4_ + auVar159._8_4_) * fVar134;
          auVar43._12_4_ = (auVar159._12_4_ + auVar159._12_4_) * fVar134;
          auVar43._16_4_ = fVar134 * 0.0;
          auVar43._20_4_ = fVar134 * 0.0;
          auVar43._24_4_ = fVar134 * 0.0;
          auVar43._28_4_ = 0;
          local_700 = auVar202._0_32_;
          auVar7 = vcmpps_avx(local_700,auVar43,6);
          auVar107 = auVar129 & auVar7;
          auVar179 = ZEXT3264(CONCAT428(local_660,
                                        CONCAT424(local_660,
                                                  CONCAT420(local_660,
                                                            CONCAT416(local_660,
                                                                      CONCAT412(local_660,
                                                                                CONCAT48(local_660,
                                                                                         CONCAT44(
                                                  local_660,local_660))))))));
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0x7f,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0xbf,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar107[0x1f]) {
            pRVar85 = (RTCIntersectArguments *)0x0;
            auVar132 = ZEXT3264(local_6e0);
          }
          else {
            local_220 = vandps_avx(auVar7,auVar129);
            auVar129._8_4_ = 0xbf800000;
            auVar129._0_8_ = 0xbf800000bf800000;
            auVar129._12_4_ = 0xbf800000;
            auVar129._16_4_ = 0xbf800000;
            auVar129._20_4_ = 0xbf800000;
            auVar129._24_4_ = 0xbf800000;
            auVar129._28_4_ = 0xbf800000;
            auVar145._8_4_ = 0x40000000;
            auVar145._0_8_ = 0x4000000040000000;
            auVar145._12_4_ = 0x40000000;
            auVar145._16_4_ = 0x40000000;
            auVar145._20_4_ = 0x40000000;
            auVar145._24_4_ = 0x40000000;
            auVar145._28_4_ = 0x40000000;
            auVar159 = vfmadd213ps_fma(local_340,auVar145,auVar129);
            local_2e0 = _local_160;
            local_2c0 = ZEXT1632(auVar159);
            local_280 = 0;
            local_260 = local_4b0._0_8_;
            uStack_258 = local_4b0._8_8_;
            local_250 = local_4c0._0_8_;
            uStack_248 = local_4c0._8_8_;
            auVar148 = ZEXT1664(local_4d0);
            local_340 = local_2c0;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              pRVar85 = (RTCIntersectArguments *)0x0;
            }
            else {
              pRVar85 = context->args;
              if ((pRVar85->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar85 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar85 >> 8),1),
                 pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar134 = 1.0 / auVar102._0_4_;
                auVar148 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar134,CONCAT420(fVar134,CONCAT416(
                                                  fVar134,CONCAT412(fVar134,CONCAT48(fVar134,
                                                  CONCAT44(fVar134,fVar134))))))));
                local_200[0] = fVar134 * ((float)local_160._0_4_ + 0.0);
                local_200[1] = fVar134 * ((float)local_160._4_4_ + 1.0);
                local_200[2] = fVar134 * (fStack_158 + 2.0);
                local_200[3] = fVar134 * (fStack_154 + 3.0);
                fStack_1f0 = fVar134 * (fStack_150 + 4.0);
                fStack_1ec = fVar134 * (fStack_14c + 5.0);
                fStack_1e8 = fVar134 * (fStack_148 + 6.0);
                fStack_1e4 = fStack_144 + 7.0;
                local_340._0_8_ = auVar159._0_8_;
                local_340._8_8_ = auVar159._8_8_;
                local_1e0 = local_340._0_8_;
                uStack_1d8 = local_340._8_8_;
                uStack_1d0 = 0;
                uStack_1c8 = 0;
                local_1c0 = local_700;
                uVar88 = vmovmskps_avx(local_220);
                local_6a0._0_4_ = (int)CONCAT71((int7)((ulong)pRVar85 >> 8),uVar88 != 0);
                uVar206 = uVar94;
                uVar207 = uVar94;
                if (uVar88 != 0) {
                  _local_840 = 0;
                  uVar89 = (ulong)(uVar88 & 0xff);
                  for (uVar84 = uVar89; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000
                      ) {
                    _local_840 = _local_840 + 1;
                  }
                  local_5e0._0_8_ = CONCAT44(uVar86,uVar86);
                  local_5e0._0_16_ = CONCAT412(uVar86,CONCAT48(uVar86,local_5e0._0_8_));
                  local_5e0 = ZEXT1632(local_5e0._0_16_);
                  local_500._0_8_ = CONCAT44(local_580,local_580);
                  local_500._0_16_ = CONCAT412(local_580,CONCAT48(local_580,local_500._0_8_));
                  local_500 = ZEXT1632(local_500._0_16_);
                  local_520 = ZEXT1632(local_4b0);
                  local_460 = ZEXT1632(local_4c0);
                  _local_560 = ZEXT1632(local_4d0);
                  auStack_530 = auVar20._16_16_;
                  local_540 = *local_640;
                  local_2a0 = local_700;
                  local_27c = iVar10;
                  local_270 = local_710;
                  uStack_268 = uStack_708;
                  local_240 = local_4d0;
                  local_680 = uVar94;
                  uStack_678 = uVar94;
                  do {
                    uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar108 = local_200[_local_840];
                    local_3c0._4_4_ = fVar108;
                    local_3c0._0_4_ = fVar108;
                    local_3c0._8_4_ = fVar108;
                    local_3c0._12_4_ = fVar108;
                    local_3b0 = *(undefined4 *)((long)&local_1e0 + _local_840 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_1c0 + _local_840 * 4);
                    fVar112 = 1.0 - fVar108;
                    auVar159 = ZEXT416((uint)(fVar108 * fVar112 * 4.0));
                    auVar14 = vfnmsub213ss_fma(local_3c0,local_3c0,auVar159);
                    auVar159 = vfmadd213ss_fma(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),
                                               auVar159);
                    auVar174 = ZEXT464(0x3f000000);
                    fVar110 = auVar159._0_4_ * 0.5;
                    fVar108 = fVar108 * fVar108 * 0.5;
                    auVar157._0_4_ = fVar108 * (float)local_560._0_4_;
                    auVar157._4_4_ = fVar108 * (float)local_560._4_4_;
                    auVar157._8_4_ = fVar108 * fStack_558;
                    auVar157._12_4_ = fVar108 * fStack_554;
                    auVar137._4_4_ = fVar110;
                    auVar137._0_4_ = fVar110;
                    auVar137._8_4_ = fVar110;
                    auVar137._12_4_ = fVar110;
                    auVar159 = vfmadd132ps_fma(auVar137,auVar157,local_460._0_16_);
                    fVar108 = auVar14._0_4_ * 0.5;
                    auVar158._4_4_ = fVar108;
                    auVar158._0_4_ = fVar108;
                    auVar158._8_4_ = fVar108;
                    auVar158._12_4_ = fVar108;
                    auVar159 = vfmadd132ps_fma(auVar158,auVar159,local_520._0_16_);
                    local_630.context = context->user;
                    fVar108 = fVar112 * -fVar112 * 0.5;
                    auVar138._4_4_ = fVar108;
                    auVar138._0_4_ = fVar108;
                    auVar138._8_4_ = fVar108;
                    auVar138._12_4_ = fVar108;
                    auVar78._8_8_ = uStack_708;
                    auVar78._0_8_ = local_710;
                    auVar159 = vfmadd132ps_fma(auVar138,auVar159,auVar78);
                    local_3f0 = auVar159._0_4_;
                    local_3e0 = vshufps_avx(auVar159,auVar159,0x55);
                    local_3d0 = vshufps_avx(auVar159,auVar159,0xaa);
                    auVar148 = ZEXT1664(local_3d0);
                    local_3a0 = local_500._0_8_;
                    uStack_398 = local_500._8_8_;
                    local_390 = local_5e0._0_16_;
                    vpcmpeqd_avx2(ZEXT1632(local_5e0._0_16_),ZEXT1632(local_5e0._0_16_));
                    uStack_37c = (local_630.context)->instID[0];
                    local_380 = uStack_37c;
                    uStack_378 = uStack_37c;
                    uStack_374 = uStack_37c;
                    uStack_370 = (local_630.context)->instPrimID[0];
                    uStack_36c = uStack_370;
                    uStack_368 = uStack_370;
                    uStack_364 = uStack_370;
                    local_7a0 = local_540._0_8_;
                    uStack_798 = local_540._8_8_;
                    local_630.valid = (int *)&local_7a0;
                    local_630.geometryUserPtr = *(void **)(CONCAT44(fStack_47c,local_480) + 0x18);
                    local_630.hit = (RTCHitN *)&local_3f0;
                    local_630.N = 4;
                    pcVar12 = *(code **)(CONCAT44(fStack_47c,local_480) + 0x48);
                    local_630.ray = (RTCRayN *)ray;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    uStack_3ac = local_3b0;
                    uStack_3a8 = local_3b0;
                    uStack_3a4 = local_3b0;
                    if (pcVar12 != (code *)0x0) {
                      auVar148 = ZEXT1664(local_3d0);
                      auVar174 = ZEXT1664(auVar174._0_16_);
                      (*pcVar12)(&local_630);
                      auVar209 = ZEXT3264(local_600);
                      auVar216 = ZEXT3264(local_780);
                      auVar194 = ZEXT3264(local_760);
                      auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                                    CONCAT424(fStack_648,
                                                              CONCAT420(fStack_64c,
                                                                        CONCAT416(fStack_650,
                                                                                  CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                      auVar192 = ZEXT3264(local_5a0);
                      auVar215 = ZEXT3264(local_6c0);
                      auVar202 = ZEXT3264(local_700);
                      uVar94 = local_680;
                      uVar205 = uStack_678;
                      uVar206 = uStack_670;
                      uVar207 = uStack_668;
                    }
                    auVar74._8_8_ = uStack_798;
                    auVar74._0_8_ = local_7a0;
                    if (auVar74 == (undefined1  [16])0x0) {
                      auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar159 = auVar159 ^ _DAT_01febe20;
                      fVar149 = (float)local_740;
                      fVar153 = local_740._4_4_;
                      fVar108 = (float)uStack_738;
                      fVar110 = uStack_738._4_4_;
                      fVar112 = (float)uStack_730;
                      fVar195 = uStack_730._4_4_;
                      fVar196 = (float)uStack_728;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(CONCAT44(fStack_47c,local_480) + 0x3e) & 0x40) != 0)))) {
                        auVar174 = ZEXT1664(auVar174._0_16_);
                        (*p_Var13)(&local_630);
                        auVar209 = ZEXT3264(local_600);
                        auVar216 = ZEXT3264(local_780);
                        auVar194 = ZEXT3264(local_760);
                        auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                                      CONCAT424(fStack_648,
                                                                CONCAT420(fStack_64c,
                                                                          CONCAT416(fStack_650,
                                                                                    CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                        auVar192 = ZEXT3264(local_5a0);
                        auVar215 = ZEXT3264(local_6c0);
                        auVar202 = ZEXT3264(local_700);
                        uVar94 = local_680;
                        uVar205 = uStack_678;
                        uVar206 = uStack_670;
                        uVar207 = uStack_668;
                      }
                      auVar75._8_8_ = uStack_798;
                      auVar75._0_8_ = local_7a0;
                      auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
                      auVar159 = auVar14 ^ _DAT_01febe20;
                      auVar139._8_4_ = 0xff800000;
                      auVar139._0_8_ = 0xff800000ff800000;
                      auVar139._12_4_ = 0xff800000;
                      auVar148 = ZEXT1664(auVar139);
                      auVar14 = vblendvps_avx(auVar139,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                              auVar14);
                      *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar14;
                      fVar149 = (float)local_740;
                      fVar153 = local_740._4_4_;
                      fVar108 = (float)uStack_738;
                      fVar110 = uStack_738._4_4_;
                      fVar112 = (float)uStack_730;
                      fVar195 = uStack_730._4_4_;
                      fVar196 = (float)uStack_728;
                    }
                    auVar121._8_8_ = 0x100000001;
                    auVar121._0_8_ = 0x100000001;
                    if ((auVar121 & auVar159) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar93;
                    uVar84 = _local_840 & 0x3f;
                    _local_840 = 0;
                    uVar89 = uVar89 ^ 1L << uVar84;
                    for (uVar84 = uVar89; (uVar84 & 1) == 0;
                        uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                      _local_840 = _local_840 + 1;
                    }
                    local_6a0._0_4_ = (int)CONCAT71((int7)(_local_840 >> 8),uVar89 != 0);
                  } while (uVar89 != 0);
                }
                pRVar85 = (RTCIntersectArguments *)
                          ((ulong)(uint)local_6a0._0_4_ & 0xffffffffffffff01);
                uStack_670 = uVar206;
                uStack_668 = uVar207;
              }
            }
            auVar132 = ZEXT3264(local_6e0);
          }
        }
      }
      if (8 < iVar10) {
        local_600 = auVar209._0_32_;
        local_460._4_4_ = iVar10;
        local_460._0_4_ = iVar10;
        local_460._8_4_ = iVar10;
        local_460._12_4_ = iVar10;
        local_460._16_4_ = iVar10;
        local_460._20_4_ = iVar10;
        local_460._24_4_ = iVar10;
        local_460._28_4_ = iVar10;
        local_100 = local_5c0._0_4_;
        uStack_fc = local_5c0._0_4_;
        uStack_f8 = local_5c0._0_4_;
        uStack_f4 = local_5c0._0_4_;
        uStack_f0 = local_5c0._0_4_;
        uStack_ec = local_5c0._0_4_;
        uStack_e8 = local_5c0._0_4_;
        uStack_e4 = local_5c0._0_4_;
        local_120 = 1.0 / (float)local_570._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_570._4_4_ = (undefined4)local_788;
        local_570._0_4_ = (undefined4)local_788;
        uStack_568 = (undefined4)local_788;
        uStack_564 = (undefined4)local_788;
        uStack_57c = local_580;
        uStack_578 = local_580;
        uStack_574 = local_580;
        lVar90 = 8;
        local_700 = auVar202._0_32_;
        uStack_678 = uVar205;
        local_680 = uVar94;
        local_480 = fVar135;
        fStack_47c = fVar135;
        fStack_478 = fVar135;
        fStack_474 = fVar135;
        fStack_470 = fVar135;
        fStack_46c = fVar135;
        fStack_468 = fVar135;
        fStack_464 = fVar135;
        do {
          local_6a0._0_4_ = (int)pRVar85;
          auVar129 = *(undefined1 (*) [32])(bspline_basis0 + lVar90 * 4 + lVar22);
          auVar7 = *(undefined1 (*) [32])(lVar22 + 0x222bfac + lVar90 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222c430 + lVar90 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar22 + 0x222c8b4 + lVar90 * 4);
          auVar83 = *pauVar2;
          auVar175._0_4_ = auVar179._0_4_ * *(float *)*pauVar2;
          auVar175._4_4_ = auVar179._4_4_ * *(float *)(*pauVar2 + 4);
          auVar175._8_4_ = auVar179._8_4_ * *(float *)(*pauVar2 + 8);
          auVar175._12_4_ = auVar179._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar175._16_4_ = auVar179._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar175._20_4_ = auVar179._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar175._28_36_ = auVar174._28_36_;
          auVar175._24_4_ = auVar179._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar174._0_4_ = fVar149 * *(float *)*pauVar2;
          auVar174._4_4_ = fVar153 * *(float *)(*pauVar2 + 4);
          auVar174._8_4_ = fVar108 * *(float *)(*pauVar2 + 8);
          auVar174._12_4_ = fVar110 * *(float *)(*pauVar2 + 0xc);
          auVar174._16_4_ = fVar112 * *(float *)(*pauVar2 + 0x10);
          auVar174._20_4_ = fVar195 * *(float *)(*pauVar2 + 0x14);
          auVar174._28_36_ = auVar148._28_36_;
          auVar174._24_4_ = fVar196 * *(float *)(*pauVar2 + 0x18);
          auVar159 = vfmadd231ps_fma(auVar175._0_32_,auVar107,auVar215._0_32_);
          auVar187 = auVar192._0_32_;
          auVar14 = vfmadd231ps_fma(auVar174._0_32_,auVar107,auVar187);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar7,auVar194._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar7,auVar132._0_32_);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar129,auVar216._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar129,local_420);
          auVar128 = *(undefined1 (*) [32])(bspline_basis1 + lVar90 * 4 + lVar22);
          auVar191 = *(undefined1 (*) [32])(lVar22 + 0x222e3cc + lVar90 * 4);
          auVar8 = *(undefined1 (*) [32])(lVar22 + 0x222e850 + lVar90 * 4);
          pfVar3 = (float *)(lVar22 + 0x222ecd4 + lVar90 * 4);
          fVar135 = *pfVar3;
          fVar134 = pfVar3[1];
          fVar109 = pfVar3[2];
          fVar111 = pfVar3[3];
          fVar113 = pfVar3[4];
          fVar114 = pfVar3[5];
          fVar115 = pfVar3[6];
          auVar180._0_4_ = fVar135 * auVar179._0_4_;
          auVar180._4_4_ = fVar134 * auVar179._4_4_;
          auVar180._8_4_ = fVar109 * auVar179._8_4_;
          auVar180._12_4_ = fVar111 * auVar179._12_4_;
          auVar180._16_4_ = fVar113 * auVar179._16_4_;
          auVar180._20_4_ = fVar114 * auVar179._20_4_;
          auVar180._28_36_ = auVar179._28_36_;
          auVar180._24_4_ = fVar115 * auVar179._24_4_;
          auVar210._0_4_ = fVar135 * fVar149;
          auVar210._4_4_ = fVar134 * fVar153;
          auVar210._8_4_ = fVar109 * fVar108;
          auVar210._12_4_ = fVar111 * fVar110;
          auVar210._16_4_ = fVar113 * fVar112;
          auVar210._20_4_ = fVar114 * fVar195;
          auVar210._28_36_ = auVar209._28_36_;
          auVar210._24_4_ = fVar115 * fVar196;
          auVar15 = vfmadd231ps_fma(auVar180._0_32_,auVar8,auVar215._0_32_);
          auVar16 = vfmadd231ps_fma(auVar210._0_32_,auVar8,auVar187);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar191,auVar194._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,auVar132._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar128,auVar216._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar128,local_420);
          auVar172 = ZEXT1632(auVar159);
          auVar101 = vsubps_avx(ZEXT1632(auVar15),auVar172);
          auVar100 = ZEXT1632(auVar16);
          local_5c0 = ZEXT1632(auVar14);
          auVar19 = vsubps_avx(auVar100,local_5c0);
          auVar20._4_4_ = auVar101._4_4_ * auVar14._4_4_;
          auVar20._0_4_ = auVar101._0_4_ * auVar14._0_4_;
          auVar20._8_4_ = auVar101._8_4_ * auVar14._8_4_;
          auVar20._12_4_ = auVar101._12_4_ * auVar14._12_4_;
          auVar20._16_4_ = auVar101._16_4_ * 0.0;
          auVar20._20_4_ = auVar101._20_4_ * 0.0;
          auVar20._24_4_ = auVar101._24_4_ * 0.0;
          auVar20._28_4_ = auVar215._28_4_;
          fVar108 = auVar19._0_4_;
          auVar148._0_4_ = fVar108 * auVar159._0_4_;
          fVar110 = auVar19._4_4_;
          auVar148._4_4_ = fVar110 * auVar159._4_4_;
          fVar112 = auVar19._8_4_;
          auVar148._8_4_ = fVar112 * auVar159._8_4_;
          fVar195 = auVar19._12_4_;
          auVar148._12_4_ = fVar195 * auVar159._12_4_;
          fVar196 = auVar19._16_4_;
          auVar148._16_4_ = fVar196 * 0.0;
          fVar116 = auVar19._20_4_;
          auVar148._20_4_ = fVar116 * 0.0;
          auVar148._28_36_ = auVar132._28_36_;
          fVar197 = auVar19._24_4_;
          auVar148._24_4_ = fVar197 * 0.0;
          auVar20 = vsubps_avx(auVar20,auVar148._0_32_);
          local_7c0._0_4_ = auVar83._0_4_;
          local_7c0._4_4_ = auVar83._4_4_;
          fStack_7b8 = auVar83._8_4_;
          fStack_7b4 = auVar83._12_4_;
          fStack_7b0 = auVar83._16_4_;
          fStack_7ac = auVar83._20_4_;
          fStack_7a8 = auVar83._24_4_;
          auVar44._4_4_ = local_e0._4_4_ * local_7c0._4_4_;
          auVar44._0_4_ = (float)local_e0 * (float)local_7c0;
          auVar44._8_4_ = (float)uStack_d8 * fStack_7b8;
          auVar44._12_4_ = uStack_d8._4_4_ * fStack_7b4;
          auVar44._16_4_ = (float)uStack_d0 * fStack_7b0;
          auVar44._20_4_ = uStack_d0._4_4_ * fStack_7ac;
          auVar44._24_4_ = (float)uStack_c8 * fStack_7a8;
          auVar44._28_4_ = auVar132._28_4_;
          auVar14 = vfmadd231ps_fma(auVar44,local_c0,auVar107);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_a0,auVar7);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_80,auVar129);
          auVar45._4_4_ = local_e0._4_4_ * fVar134;
          auVar45._0_4_ = (float)local_e0 * fVar135;
          auVar45._8_4_ = (float)uStack_d8 * fVar109;
          auVar45._12_4_ = uStack_d8._4_4_ * fVar111;
          auVar45._16_4_ = (float)uStack_d0 * fVar113;
          auVar45._20_4_ = uStack_d0._4_4_ * fVar114;
          auVar45._24_4_ = (float)uStack_c8 * fVar115;
          auVar45._28_4_ = uStack_c8._4_4_;
          auVar16 = vfmadd231ps_fma(auVar45,auVar8,local_c0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar191,local_a0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar128,local_80);
          auVar209 = ZEXT1664(auVar16);
          auVar174 = ZEXT3264(auVar187);
          auVar179._0_4_ = fVar108 * fVar108;
          auVar179._4_4_ = fVar110 * fVar110;
          auVar179._8_4_ = fVar112 * fVar112;
          auVar179._12_4_ = fVar195 * fVar195;
          auVar179._16_4_ = fVar196 * fVar196;
          auVar179._20_4_ = fVar116 * fVar116;
          auVar179._28_36_ = auVar192._28_36_;
          auVar179._24_4_ = fVar197 * fVar197;
          auVar17 = vfmadd231ps_fma(auVar179._0_32_,auVar101,auVar101);
          auVar148 = ZEXT3264(local_6c0);
          auVar130 = ZEXT1632(auVar14);
          auVar102 = ZEXT1632(auVar16);
          auVar146 = vmaxps_avx(auVar130,auVar102);
          auVar188._0_4_ = auVar146._0_4_ * auVar146._0_4_ * auVar17._0_4_;
          auVar188._4_4_ = auVar146._4_4_ * auVar146._4_4_ * auVar17._4_4_;
          auVar188._8_4_ = auVar146._8_4_ * auVar146._8_4_ * auVar17._8_4_;
          auVar188._12_4_ = auVar146._12_4_ * auVar146._12_4_ * auVar17._12_4_;
          auVar188._16_4_ = auVar146._16_4_ * auVar146._16_4_ * 0.0;
          auVar188._20_4_ = auVar146._20_4_ * auVar146._20_4_ * 0.0;
          auVar188._24_4_ = auVar146._24_4_ * auVar146._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar46._4_4_ = auVar20._4_4_ * auVar20._4_4_;
          auVar46._0_4_ = auVar20._0_4_ * auVar20._0_4_;
          auVar46._8_4_ = auVar20._8_4_ * auVar20._8_4_;
          auVar46._12_4_ = auVar20._12_4_ * auVar20._12_4_;
          auVar46._16_4_ = auVar20._16_4_ * auVar20._16_4_;
          auVar46._20_4_ = auVar20._20_4_ * auVar20._20_4_;
          auVar46._24_4_ = auVar20._24_4_ * auVar20._24_4_;
          auVar46._28_4_ = auVar20._28_4_;
          auVar146 = vcmpps_avx(auVar46,auVar188,2);
          local_280 = (int)lVar90;
          auVar189._4_4_ = local_280;
          auVar189._0_4_ = local_280;
          auVar189._8_4_ = local_280;
          auVar189._12_4_ = local_280;
          auVar189._16_4_ = local_280;
          auVar189._20_4_ = local_280;
          auVar189._24_4_ = local_280;
          auVar189._28_4_ = local_280;
          auVar20 = vpor_avx2(auVar189,_DAT_0205a920);
          auVar21 = vpcmpgtd_avx2(local_460,auVar20);
          auVar20 = auVar21 & auVar146;
          fVar149 = (float)local_740;
          fVar153 = local_740._4_4_;
          fVar108 = (float)uStack_738;
          fVar110 = uStack_738._4_4_;
          fVar112 = (float)uStack_730;
          fVar195 = uStack_730._4_4_;
          fVar196 = (float)uStack_728;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0x7f,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar20 >> 0xbf,0) == '\0') &&
              (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar20[0x1f]) {
            auVar132 = ZEXT3264(local_6e0);
            auVar215 = ZEXT3264(local_6c0);
            auVar192 = ZEXT3264(auVar187);
            auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar194 = ZEXT3264(local_760);
            auVar216 = ZEXT3264(local_780);
            pRVar85 = (RTCIntersectArguments *)((ulong)pRVar85 & 0xffffffff);
          }
          else {
            auVar20 = vandps_avx(auVar21,auVar146);
            auVar47._4_4_ = fVar134 * local_680._4_4_;
            auVar47._0_4_ = fVar135 * (float)local_680;
            auVar47._8_4_ = fVar109 * (float)uStack_678;
            auVar47._12_4_ = fVar111 * uStack_678._4_4_;
            auVar47._16_4_ = fVar113 * (float)uStack_670;
            auVar47._20_4_ = fVar114 * uStack_670._4_4_;
            auVar47._24_4_ = fVar115 * (float)uStack_668;
            auVar47._28_4_ = auVar146._28_4_;
            auVar14 = vfmadd213ps_fma(auVar8,local_440,auVar47);
            auVar14 = vfmadd213ps_fma(auVar191,local_140,ZEXT1632(auVar14));
            auVar14 = vfmadd132ps_fma(auVar128,ZEXT1632(auVar14),local_600);
            local_320 = ZEXT1632(auVar14);
            auVar48._4_4_ = local_680._4_4_ * local_7c0._4_4_;
            auVar48._0_4_ = (float)local_680 * (float)local_7c0;
            auVar48._8_4_ = (float)uStack_678 * fStack_7b8;
            auVar48._12_4_ = uStack_678._4_4_ * fStack_7b4;
            auVar48._16_4_ = (float)uStack_670 * fStack_7b0;
            auVar48._20_4_ = uStack_670._4_4_ * fStack_7ac;
            auVar48._24_4_ = (float)uStack_668 * fStack_7a8;
            auVar48._28_4_ = auVar146._28_4_;
            auVar14 = vfmadd213ps_fma(auVar107,local_440,auVar48);
            auVar14 = vfmadd213ps_fma(auVar7,local_140,ZEXT1632(auVar14));
            auVar7 = *(undefined1 (*) [32])(lVar22 + 0x222cd38 + lVar90 * 4);
            auVar107 = *(undefined1 (*) [32])(lVar22 + 0x222d1bc + lVar90 * 4);
            auVar128 = *(undefined1 (*) [32])(lVar22 + 0x222d640 + lVar90 * 4);
            pfVar4 = (float *)(lVar22 + 0x222dac4 + lVar90 * 4);
            fVar135 = *pfVar4;
            fVar134 = pfVar4[1];
            fVar109 = pfVar4[2];
            fVar111 = pfVar4[3];
            fVar113 = pfVar4[4];
            fVar114 = pfVar4[5];
            fVar115 = pfVar4[6];
            auVar183._0_4_ = fVar135 * local_660;
            auVar183._4_4_ = fVar134 * fStack_65c;
            auVar183._8_4_ = fVar109 * fStack_658;
            auVar183._12_4_ = fVar111 * fStack_654;
            auVar183._16_4_ = fVar113 * fStack_650;
            auVar183._20_4_ = fVar114 * fStack_64c;
            auVar183._24_4_ = fVar115 * fStack_648;
            auVar183._28_4_ = 0;
            auVar49._4_4_ = fVar134 * local_740._4_4_;
            auVar49._0_4_ = fVar135 * (float)local_740;
            auVar49._8_4_ = fVar109 * (float)uStack_738;
            auVar49._12_4_ = fVar111 * uStack_738._4_4_;
            auVar49._16_4_ = fVar113 * (float)uStack_730;
            auVar49._20_4_ = fVar114 * uStack_730._4_4_;
            auVar49._24_4_ = fVar115 * (float)uStack_728;
            auVar49._28_4_ = pfVar3[7];
            auVar50._4_4_ = fVar134 * local_680._4_4_;
            auVar50._0_4_ = fVar135 * (float)local_680;
            auVar50._8_4_ = fVar109 * (float)uStack_678;
            auVar50._12_4_ = fVar111 * uStack_678._4_4_;
            auVar50._16_4_ = fVar113 * (float)uStack_670;
            auVar50._20_4_ = fVar114 * uStack_670._4_4_;
            auVar50._24_4_ = fVar115 * (float)uStack_668;
            auVar50._28_4_ = pfVar4[7];
            auVar17 = vfmadd231ps_fma(auVar183,auVar128,local_6c0);
            auVar18 = vfmadd231ps_fma(auVar49,auVar128,auVar187);
            auVar98 = vfmadd231ps_fma(auVar50,local_440,auVar128);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,local_760);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar107,local_6e0);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),local_140,auVar107);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar7,local_780);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar7,local_420);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar7,local_600);
            pfVar3 = (float *)(lVar22 + 0x222fee4 + lVar90 * 4);
            fVar135 = *pfVar3;
            fVar134 = pfVar3[1];
            fVar109 = pfVar3[2];
            fVar111 = pfVar3[3];
            fVar113 = pfVar3[4];
            fVar114 = pfVar3[5];
            fVar115 = pfVar3[6];
            auVar51._4_4_ = fStack_65c * fVar134;
            auVar51._0_4_ = local_660 * fVar135;
            auVar51._8_4_ = fStack_658 * fVar109;
            auVar51._12_4_ = fStack_654 * fVar111;
            auVar51._16_4_ = fStack_650 * fVar113;
            auVar51._20_4_ = fStack_64c * fVar114;
            auVar51._24_4_ = fStack_648 * fVar115;
            auVar51._28_4_ = local_140._28_4_;
            auVar52._4_4_ = local_740._4_4_ * fVar134;
            auVar52._0_4_ = (float)local_740 * fVar135;
            auVar52._8_4_ = (float)uStack_738 * fVar109;
            auVar52._12_4_ = uStack_738._4_4_ * fVar111;
            auVar52._16_4_ = (float)uStack_730 * fVar113;
            auVar52._20_4_ = uStack_730._4_4_ * fVar114;
            auVar52._24_4_ = (float)uStack_728 * fVar115;
            auVar52._28_4_ = auVar101._28_4_;
            auVar53._4_4_ = fVar134 * local_680._4_4_;
            auVar53._0_4_ = fVar135 * (float)local_680;
            auVar53._8_4_ = fVar109 * (float)uStack_678;
            auVar53._12_4_ = fVar111 * uStack_678._4_4_;
            auVar53._16_4_ = fVar113 * (float)uStack_670;
            auVar53._20_4_ = fVar114 * uStack_670._4_4_;
            auVar53._24_4_ = fVar115 * (float)uStack_668;
            auVar53._28_4_ = pfVar3[7];
            auVar7 = *(undefined1 (*) [32])(lVar22 + 0x222fa60 + lVar90 * 4);
            auVar97 = vfmadd231ps_fma(auVar51,auVar7,local_6c0);
            auVar136 = vfmadd231ps_fma(auVar52,auVar7,local_5a0);
            auVar119 = vfmadd231ps_fma(auVar53,local_440,auVar7);
            auVar7 = *(undefined1 (*) [32])(lVar22 + 0x222f5dc + lVar90 * 4);
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar7,local_760);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar7,local_6e0);
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar7,local_140);
            auVar7 = *(undefined1 (*) [32])(lVar22 + 0x222f158 + lVar90 * 4);
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar7,local_780);
            auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar7,local_420);
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),local_600,auVar7);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar190._16_4_ = 0x7fffffff;
            auVar190._20_4_ = 0x7fffffff;
            auVar190._24_4_ = 0x7fffffff;
            auVar190._28_4_ = 0x7fffffff;
            auVar7 = vandps_avx(ZEXT1632(auVar17),auVar190);
            auVar107 = vandps_avx(ZEXT1632(auVar18),auVar190);
            auVar107 = vmaxps_avx(auVar7,auVar107);
            auVar7 = vandps_avx(ZEXT1632(auVar98),auVar190);
            auVar7 = vmaxps_avx(auVar107,auVar7);
            auVar80._4_4_ = fStack_47c;
            auVar80._0_4_ = local_480;
            auVar80._8_4_ = fStack_478;
            auVar80._12_4_ = fStack_474;
            auVar80._16_4_ = fStack_470;
            auVar80._20_4_ = fStack_46c;
            auVar80._24_4_ = fStack_468;
            auVar80._28_4_ = fStack_464;
            auVar7 = vcmpps_avx(auVar7,auVar80,1);
            auVar128 = vblendvps_avx(ZEXT1632(auVar17),auVar101,auVar7);
            auVar191 = vblendvps_avx(ZEXT1632(auVar18),auVar19,auVar7);
            auVar7 = vandps_avx(ZEXT1632(auVar97),auVar190);
            auVar107 = vandps_avx(ZEXT1632(auVar136),auVar190);
            auVar107 = vmaxps_avx(auVar7,auVar107);
            auVar7 = vandps_avx(auVar190,ZEXT1632(auVar119));
            auVar7 = vmaxps_avx(auVar107,auVar7);
            auVar107 = vcmpps_avx(auVar7,auVar80,1);
            auVar7 = vblendvps_avx(ZEXT1632(auVar97),auVar101,auVar107);
            auVar107 = vblendvps_avx(ZEXT1632(auVar136),auVar19,auVar107);
            auVar14 = vfmadd213ps_fma(auVar129,local_600,ZEXT1632(auVar14));
            auVar17 = vfmadd213ps_fma(auVar128,auVar128,ZEXT832(0) << 0x20);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,auVar191);
            auVar129 = vrsqrtps_avx(ZEXT1632(auVar17));
            fVar135 = auVar129._0_4_;
            fVar134 = auVar129._4_4_;
            fVar109 = auVar129._8_4_;
            fVar111 = auVar129._12_4_;
            fVar113 = auVar129._16_4_;
            fVar114 = auVar129._20_4_;
            fVar115 = auVar129._24_4_;
            auVar54._4_4_ = fVar134 * fVar134 * fVar134 * auVar17._4_4_ * -0.5;
            auVar54._0_4_ = fVar135 * fVar135 * fVar135 * auVar17._0_4_ * -0.5;
            auVar54._8_4_ = fVar109 * fVar109 * fVar109 * auVar17._8_4_ * -0.5;
            auVar54._12_4_ = fVar111 * fVar111 * fVar111 * auVar17._12_4_ * -0.5;
            auVar54._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
            auVar54._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar54._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar54._28_4_ = 0;
            auVar214._8_4_ = 0x3fc00000;
            auVar214._0_8_ = 0x3fc000003fc00000;
            auVar214._12_4_ = 0x3fc00000;
            auVar214._16_4_ = 0x3fc00000;
            auVar214._20_4_ = 0x3fc00000;
            auVar214._24_4_ = 0x3fc00000;
            auVar214._28_4_ = 0x3fc00000;
            auVar17 = vfmadd231ps_fma(auVar54,auVar214,auVar129);
            fVar135 = auVar17._0_4_;
            fVar134 = auVar17._4_4_;
            auVar55._4_4_ = auVar191._4_4_ * fVar134;
            auVar55._0_4_ = auVar191._0_4_ * fVar135;
            fVar109 = auVar17._8_4_;
            auVar55._8_4_ = auVar191._8_4_ * fVar109;
            fVar111 = auVar17._12_4_;
            auVar55._12_4_ = auVar191._12_4_ * fVar111;
            auVar55._16_4_ = auVar191._16_4_ * 0.0;
            auVar55._20_4_ = auVar191._20_4_ * 0.0;
            auVar55._24_4_ = auVar191._24_4_ * 0.0;
            auVar55._28_4_ = auVar129._28_4_;
            auVar56._4_4_ = fVar134 * -auVar128._4_4_;
            auVar56._0_4_ = fVar135 * -auVar128._0_4_;
            auVar56._8_4_ = fVar109 * -auVar128._8_4_;
            auVar56._12_4_ = fVar111 * -auVar128._12_4_;
            auVar56._16_4_ = -auVar128._16_4_ * 0.0;
            auVar56._20_4_ = -auVar128._20_4_ * 0.0;
            auVar56._24_4_ = -auVar128._24_4_ * 0.0;
            auVar56._28_4_ = auVar191._28_4_;
            auVar17 = vfmadd213ps_fma(auVar7,auVar7,ZEXT832(0) << 0x20);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar107,auVar107);
            auVar129 = vrsqrtps_avx(ZEXT1632(auVar17));
            auVar57._28_4_ = local_780._28_4_;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar111 * 0.0,
                                    CONCAT48(fVar109 * 0.0,CONCAT44(fVar134 * 0.0,fVar135 * 0.0))));
            fVar135 = auVar129._0_4_;
            fVar134 = auVar129._4_4_;
            fVar109 = auVar129._8_4_;
            fVar111 = auVar129._12_4_;
            fVar113 = auVar129._16_4_;
            fVar114 = auVar129._20_4_;
            fVar115 = auVar129._24_4_;
            auVar58._4_4_ = fVar134 * fVar134 * fVar134 * auVar17._4_4_ * -0.5;
            auVar58._0_4_ = fVar135 * fVar135 * fVar135 * auVar17._0_4_ * -0.5;
            auVar58._8_4_ = fVar109 * fVar109 * fVar109 * auVar17._8_4_ * -0.5;
            auVar58._12_4_ = fVar111 * fVar111 * fVar111 * auVar17._12_4_ * -0.5;
            auVar58._16_4_ = fVar113 * fVar113 * fVar113 * -0.0;
            auVar58._20_4_ = fVar114 * fVar114 * fVar114 * -0.0;
            auVar58._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar58._28_4_ = 0;
            auVar17 = vfmadd231ps_fma(auVar58,auVar214,auVar129);
            fVar135 = auVar17._0_4_;
            fVar134 = auVar17._4_4_;
            auVar59._4_4_ = auVar107._4_4_ * fVar134;
            auVar59._0_4_ = auVar107._0_4_ * fVar135;
            fVar109 = auVar17._8_4_;
            auVar59._8_4_ = auVar107._8_4_ * fVar109;
            fVar111 = auVar17._12_4_;
            auVar59._12_4_ = auVar107._12_4_ * fVar111;
            auVar59._16_4_ = auVar107._16_4_ * 0.0;
            auVar59._20_4_ = auVar107._20_4_ * 0.0;
            auVar59._24_4_ = auVar107._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = fVar134 * -auVar7._4_4_;
            auVar60._0_4_ = fVar135 * -auVar7._0_4_;
            auVar60._8_4_ = fVar109 * -auVar7._8_4_;
            auVar60._12_4_ = fVar111 * -auVar7._12_4_;
            auVar60._16_4_ = -auVar7._16_4_ * 0.0;
            auVar60._20_4_ = -auVar7._20_4_ * 0.0;
            auVar60._24_4_ = -auVar7._24_4_ * 0.0;
            auVar60._28_4_ = auVar129._28_4_;
            auVar61._28_4_ = 0xbf000000;
            auVar61._0_28_ =
                 ZEXT1628(CONCAT412(fVar111 * 0.0,
                                    CONCAT48(fVar109 * 0.0,CONCAT44(fVar134 * 0.0,fVar135 * 0.0))));
            auVar17 = vfmadd213ps_fma(auVar55,auVar130,auVar172);
            auVar18 = vfmadd213ps_fma(auVar56,auVar130,local_5c0);
            auVar98 = vfmadd213ps_fma(auVar57,auVar130,ZEXT1632(auVar14));
            auVar96 = vfnmadd213ps_fma(auVar55,auVar130,auVar172);
            auVar97 = vfmadd213ps_fma(auVar59,auVar102,ZEXT1632(auVar15));
            auVar120 = vfnmadd213ps_fma(auVar56,auVar130,local_5c0);
            auVar136 = vfmadd213ps_fma(auVar60,auVar102,auVar100);
            auVar14 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar130,auVar57);
            auVar119 = vfmadd213ps_fma(auVar61,auVar102,local_320);
            auVar150 = vfnmadd213ps_fma(auVar59,auVar102,ZEXT1632(auVar15));
            auVar155 = vfnmadd213ps_fma(auVar60,auVar102,auVar100);
            auVar95 = vfnmadd231ps_fma(local_320,auVar102,auVar61);
            auVar129 = vsubps_avx(ZEXT1632(auVar136),ZEXT1632(auVar120));
            auVar7 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar14));
            auVar62._4_4_ = auVar129._4_4_ * auVar14._4_4_;
            auVar62._0_4_ = auVar129._0_4_ * auVar14._0_4_;
            auVar62._8_4_ = auVar129._8_4_ * auVar14._8_4_;
            auVar62._12_4_ = auVar129._12_4_ * auVar14._12_4_;
            auVar62._16_4_ = auVar129._16_4_ * 0.0;
            auVar62._20_4_ = auVar129._20_4_ * 0.0;
            auVar62._24_4_ = auVar129._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar120),auVar7);
            auVar63._4_4_ = auVar96._4_4_ * auVar7._4_4_;
            auVar63._0_4_ = auVar96._0_4_ * auVar7._0_4_;
            auVar63._8_4_ = auVar96._8_4_ * auVar7._8_4_;
            auVar63._12_4_ = auVar96._12_4_ * auVar7._12_4_;
            auVar63._16_4_ = auVar7._16_4_ * 0.0;
            auVar63._20_4_ = auVar7._20_4_ * 0.0;
            auVar63._24_4_ = auVar7._24_4_ * 0.0;
            auVar63._28_4_ = auVar7._28_4_;
            auVar191 = ZEXT1632(auVar96);
            auVar7 = vsubps_avx(ZEXT1632(auVar97),auVar191);
            auVar146 = ZEXT1632(auVar14);
            auVar14 = vfmsub231ps_fma(auVar63,auVar146,auVar7);
            auVar64._4_4_ = auVar120._4_4_ * auVar7._4_4_;
            auVar64._0_4_ = auVar120._0_4_ * auVar7._0_4_;
            auVar64._8_4_ = auVar120._8_4_ * auVar7._8_4_;
            auVar64._12_4_ = auVar120._12_4_ * auVar7._12_4_;
            auVar64._16_4_ = auVar7._16_4_ * 0.0;
            auVar64._20_4_ = auVar7._20_4_ * 0.0;
            auVar64._24_4_ = auVar7._24_4_ * 0.0;
            auVar64._28_4_ = auVar7._28_4_;
            auVar96 = vfmsub231ps_fma(auVar64,auVar191,auVar129);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar101 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            auVar129 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar17),auVar101);
            _local_840 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar18),auVar101);
            local_5c0 = vblendvps_avx(ZEXT1632(auVar95),ZEXT1632(auVar98),auVar101);
            auVar7 = vblendvps_avx(auVar191,ZEXT1632(auVar97),auVar101);
            auVar107 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar136),auVar101);
            auVar128 = vblendvps_avx(auVar146,ZEXT1632(auVar119),auVar101);
            auVar191 = vblendvps_avx(ZEXT1632(auVar97),auVar191,auVar101);
            auVar8 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar120),auVar101);
            auVar14 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
            auVar146 = vblendvps_avx(ZEXT1632(auVar119),auVar146,auVar101);
            auVar191 = vsubps_avx(auVar191,auVar129);
            auVar8 = vsubps_avx(auVar8,_local_840);
            auVar21 = vsubps_avx(auVar146,local_5c0);
            auVar172 = vsubps_avx(auVar129,auVar7);
            auVar187 = vsubps_avx(_local_840,auVar107);
            auVar100 = vsubps_avx(local_5c0,auVar128);
            auVar167._0_4_ = auVar21._0_4_ * auVar129._0_4_;
            auVar167._4_4_ = auVar21._4_4_ * auVar129._4_4_;
            auVar167._8_4_ = auVar21._8_4_ * auVar129._8_4_;
            auVar167._12_4_ = auVar21._12_4_ * auVar129._12_4_;
            auVar167._16_4_ = auVar21._16_4_ * auVar129._16_4_;
            auVar167._20_4_ = auVar21._20_4_ * auVar129._20_4_;
            auVar167._24_4_ = auVar21._24_4_ * auVar129._24_4_;
            auVar167._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar167,local_5c0,auVar191);
            auVar65._4_4_ = auVar191._4_4_ * local_840._4_4_;
            auVar65._0_4_ = auVar191._0_4_ * local_840;
            auVar65._8_4_ = auVar191._8_4_ * local_840._8_4_;
            auVar65._12_4_ = auVar191._12_4_ * local_840._12_4_;
            auVar65._16_4_ = auVar191._16_4_ * local_840._16_4_;
            auVar65._20_4_ = auVar191._20_4_ * local_840._20_4_;
            auVar65._24_4_ = auVar191._24_4_ * local_840._24_4_;
            auVar65._28_4_ = auVar146._28_4_;
            auVar17 = vfmsub231ps_fma(auVar65,auVar129,auVar8);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632((undefined1  [16])0x0),
                                      ZEXT1632(auVar15));
            auVar168._0_4_ = auVar8._0_4_ * local_5c0._0_4_;
            auVar168._4_4_ = auVar8._4_4_ * local_5c0._4_4_;
            auVar168._8_4_ = auVar8._8_4_ * local_5c0._8_4_;
            auVar168._12_4_ = auVar8._12_4_ * local_5c0._12_4_;
            auVar168._16_4_ = auVar8._16_4_ * local_5c0._16_4_;
            auVar168._20_4_ = auVar8._20_4_ * local_5c0._20_4_;
            auVar168._24_4_ = auVar8._24_4_ * local_5c0._24_4_;
            auVar168._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar168,_local_840,auVar21);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632((undefined1  [16])0x0),
                                      ZEXT1632(auVar17));
            auVar148 = ZEXT1664(auVar17);
            auVar169._0_4_ = auVar100._0_4_ * auVar7._0_4_;
            auVar169._4_4_ = auVar100._4_4_ * auVar7._4_4_;
            auVar169._8_4_ = auVar100._8_4_ * auVar7._8_4_;
            auVar169._12_4_ = auVar100._12_4_ * auVar7._12_4_;
            auVar169._16_4_ = auVar100._16_4_ * auVar7._16_4_;
            auVar169._20_4_ = auVar100._20_4_ * auVar7._20_4_;
            auVar169._24_4_ = auVar100._24_4_ * auVar7._24_4_;
            auVar169._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar169,auVar172,auVar128);
            auVar66._4_4_ = auVar187._4_4_ * auVar128._4_4_;
            auVar66._0_4_ = auVar187._0_4_ * auVar128._0_4_;
            auVar66._8_4_ = auVar187._8_4_ * auVar128._8_4_;
            auVar66._12_4_ = auVar187._12_4_ * auVar128._12_4_;
            auVar66._16_4_ = auVar187._16_4_ * auVar128._16_4_;
            auVar66._20_4_ = auVar187._20_4_ * auVar128._20_4_;
            auVar66._24_4_ = auVar187._24_4_ * auVar128._24_4_;
            auVar66._28_4_ = auVar129._28_4_;
            auVar18 = vfmsub231ps_fma(auVar66,auVar107,auVar100);
            auVar67._4_4_ = auVar172._4_4_ * auVar107._4_4_;
            auVar67._0_4_ = auVar172._0_4_ * auVar107._0_4_;
            auVar67._8_4_ = auVar172._8_4_ * auVar107._8_4_;
            auVar67._12_4_ = auVar172._12_4_ * auVar107._12_4_;
            auVar67._16_4_ = auVar172._16_4_ * auVar107._16_4_;
            auVar67._20_4_ = auVar172._20_4_ * auVar107._20_4_;
            auVar67._24_4_ = auVar172._24_4_ * auVar107._24_4_;
            auVar67._28_4_ = auVar107._28_4_;
            auVar98 = vfmsub231ps_fma(auVar67,auVar187,auVar7);
            auVar107 = ZEXT1632((undefined1  [16])0x0);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar107,ZEXT1632(auVar15));
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar107,ZEXT1632(auVar18));
            auVar7 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
            auVar7 = vcmpps_avx(auVar7,auVar107,2);
            auVar98 = auVar7._16_16_;
            auVar15 = vpackssdw_avx(auVar7._0_16_,auVar98);
            auVar14 = vpand_avx(auVar15,auVar14);
            auVar7 = vpmovsxwd_avx2(auVar14);
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar7 >> 0x7f,0) == '\0') &&
                  (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar7 >> 0xbf,0) == '\0') &&
                (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar7[0x1f]) {
LAB_016768cb:
              auVar152._8_8_ = uStack_498;
              auVar152._0_8_ = local_4a0;
              auVar152._16_8_ = uStack_490;
              auVar152._24_8_ = uStack_488;
              auVar174 = ZEXT1664(auVar98);
            }
            else {
              auVar68._4_4_ = auVar8._4_4_ * auVar100._4_4_;
              auVar68._0_4_ = auVar8._0_4_ * auVar100._0_4_;
              auVar68._8_4_ = auVar8._8_4_ * auVar100._8_4_;
              auVar68._12_4_ = auVar8._12_4_ * auVar100._12_4_;
              auVar68._16_4_ = auVar8._16_4_ * auVar100._16_4_;
              auVar68._20_4_ = auVar8._20_4_ * auVar100._20_4_;
              auVar68._24_4_ = auVar8._24_4_ * auVar100._24_4_;
              auVar68._28_4_ = auVar7._28_4_;
              auVar136 = vfmsub231ps_fma(auVar68,auVar187,auVar21);
              auVar173._0_4_ = auVar21._0_4_ * auVar172._0_4_;
              auVar173._4_4_ = auVar21._4_4_ * auVar172._4_4_;
              auVar173._8_4_ = auVar21._8_4_ * auVar172._8_4_;
              auVar173._12_4_ = auVar21._12_4_ * auVar172._12_4_;
              auVar173._16_4_ = auVar21._16_4_ * auVar172._16_4_;
              auVar173._20_4_ = auVar21._20_4_ * auVar172._20_4_;
              auVar173._24_4_ = auVar21._24_4_ * auVar172._24_4_;
              auVar173._28_4_ = 0;
              auVar98 = vfmsub231ps_fma(auVar173,auVar191,auVar100);
              auVar69._4_4_ = auVar191._4_4_ * auVar187._4_4_;
              auVar69._0_4_ = auVar191._0_4_ * auVar187._0_4_;
              auVar69._8_4_ = auVar191._8_4_ * auVar187._8_4_;
              auVar69._12_4_ = auVar191._12_4_ * auVar187._12_4_;
              auVar69._16_4_ = auVar191._16_4_ * auVar187._16_4_;
              auVar69._20_4_ = auVar191._20_4_ * auVar187._20_4_;
              auVar69._24_4_ = auVar191._24_4_ * auVar187._24_4_;
              auVar69._28_4_ = auVar187._28_4_;
              auVar119 = vfmsub231ps_fma(auVar69,auVar172,auVar8);
              auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar98),ZEXT1632(auVar119));
              auVar97 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar136),auVar107);
              auVar7 = vrcpps_avx(ZEXT1632(auVar97));
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = &DAT_3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar15 = vfnmadd213ps_fma(auVar7,ZEXT1632(auVar97),auVar204);
              auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar7,auVar7);
              auVar70._4_4_ = auVar119._4_4_ * local_5c0._4_4_;
              auVar70._0_4_ = auVar119._0_4_ * local_5c0._0_4_;
              auVar70._8_4_ = auVar119._8_4_ * local_5c0._8_4_;
              auVar70._12_4_ = auVar119._12_4_ * local_5c0._12_4_;
              auVar70._16_4_ = local_5c0._16_4_ * 0.0;
              auVar70._20_4_ = local_5c0._20_4_ * 0.0;
              auVar70._24_4_ = local_5c0._24_4_ * 0.0;
              auVar70._28_4_ = local_840._28_4_;
              auVar98 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar98),_local_840);
              auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT1632(auVar136),auVar129);
              fVar135 = auVar15._0_4_;
              fVar134 = auVar15._4_4_;
              fVar109 = auVar15._8_4_;
              fVar111 = auVar15._12_4_;
              auVar107 = ZEXT1632(CONCAT412(fVar111 * auVar98._12_4_,
                                            CONCAT48(fVar109 * auVar98._8_4_,
                                                     CONCAT44(fVar134 * auVar98._4_4_,
                                                              fVar135 * auVar98._0_4_))));
              uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar151._4_4_ = uVar93;
              auVar151._0_4_ = uVar93;
              auVar151._8_4_ = uVar93;
              auVar151._12_4_ = uVar93;
              auVar151._16_4_ = uVar93;
              auVar151._20_4_ = uVar93;
              auVar151._24_4_ = uVar93;
              auVar151._28_4_ = uVar93;
              auVar81._4_4_ = uStack_fc;
              auVar81._0_4_ = local_100;
              auVar81._8_4_ = uStack_f8;
              auVar81._12_4_ = uStack_f4;
              auVar81._16_4_ = uStack_f0;
              auVar81._20_4_ = uStack_ec;
              auVar81._24_4_ = uStack_e8;
              auVar81._28_4_ = uStack_e4;
              auVar129 = vcmpps_avx(auVar81,auVar107,2);
              auVar7 = vcmpps_avx(auVar107,auVar151,2);
              auVar129 = vandps_avx(auVar7,auVar129);
              auVar15 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
              auVar14 = vpand_avx(auVar14,auVar15);
              auVar129 = vpmovsxwd_avx2(auVar14);
              auVar98 = ZEXT816(0) << 0x20;
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar129 >> 0x7f,0) == '\0') &&
                    (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar129 >> 0xbf,0) == '\0') &&
                  (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar129[0x1f]) goto LAB_016768cb;
              auVar129 = vcmpps_avx(ZEXT1632(auVar97),ZEXT832(0) << 0x20,4);
              auVar15 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
              auVar14 = vpand_avx(auVar14,auVar15);
              auVar129 = vpmovsxwd_avx2(auVar14);
              auVar174 = ZEXT3264(auVar129);
              auVar152._8_8_ = uStack_498;
              auVar152._0_8_ = local_4a0;
              auVar152._16_8_ = uStack_490;
              auVar152._24_8_ = uStack_488;
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar129 >> 0x7f,0) != '\0') ||
                    (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar129 >> 0xbf,0) != '\0') ||
                  (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar129[0x1f] < '\0') {
                auVar128 = ZEXT1632(CONCAT412(fVar111 * auVar17._12_4_,
                                              CONCAT48(fVar109 * auVar17._8_4_,
                                                       CONCAT44(fVar134 * auVar17._4_4_,
                                                                fVar135 * auVar17._0_4_))));
                auVar71._28_4_ = SUB84(uStack_488,4);
                auVar71._0_28_ =
                     ZEXT1628(CONCAT412(fVar111 * auVar18._12_4_,
                                        CONCAT48(fVar109 * auVar18._8_4_,
                                                 CONCAT44(fVar134 * auVar18._4_4_,
                                                          fVar135 * auVar18._0_4_))));
                auVar184._8_4_ = 0x3f800000;
                auVar184._0_8_ = &DAT_3f8000003f800000;
                auVar184._12_4_ = 0x3f800000;
                auVar184._16_4_ = 0x3f800000;
                auVar184._20_4_ = 0x3f800000;
                auVar184._24_4_ = 0x3f800000;
                auVar184._28_4_ = 0x3f800000;
                auVar7 = vsubps_avx(auVar184,auVar128);
                _local_180 = vblendvps_avx(auVar7,auVar128,auVar101);
                auVar7 = vsubps_avx(auVar184,auVar71);
                local_360 = vblendvps_avx(auVar7,auVar71,auVar101);
                auVar148 = ZEXT3264(local_360);
                local_1a0 = auVar107;
                auVar152 = auVar129;
              }
            }
            auVar216 = ZEXT3264(local_780);
            auVar215 = ZEXT3264(local_6c0);
            auVar202 = ZEXT3264(local_700);
            auVar194 = ZEXT3264(local_760);
            auVar209 = ZEXT3264(auVar102);
            pRVar85 = (RTCIntersectArguments *)((ulong)pRVar85 & 0xffffffff);
            auVar192 = ZEXT3264(local_5a0);
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar152 >> 0x7f,0) == '\0') &&
                  (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar152 >> 0xbf,0) == '\0') &&
                (auVar152 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar152[0x1f]) {
              auVar132 = ZEXT3264(local_6e0);
              auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                            CONCAT424(fStack_648,
                                                      CONCAT420(fStack_64c,
                                                                CONCAT416(fStack_650,
                                                                          CONCAT412(fStack_654,
                                                                                    CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            }
            else {
              auVar129 = vsubps_avx(auVar102,auVar130);
              auVar14 = vfmadd213ps_fma(auVar129,_local_180,auVar130);
              fVar135 = *(float *)((long)local_638->ray_space + k * 4 + -0x10);
              auVar72._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar135;
              auVar72._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar135;
              auVar72._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar135;
              auVar72._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar135;
              auVar72._16_4_ = fVar135 * 0.0;
              auVar72._20_4_ = fVar135 * 0.0;
              auVar72._24_4_ = fVar135 * 0.0;
              auVar72._28_4_ = fVar135;
              auVar129 = vcmpps_avx(local_1a0,auVar72,6);
              auVar7 = auVar152 & auVar129;
              auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                            CONCAT424(fStack_648,
                                                      CONCAT420(fStack_64c,
                                                                CONCAT416(fStack_650,
                                                                          CONCAT412(fStack_654,
                                                                                    CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar7 >> 0x7f,0) == '\0') &&
                    (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar7 >> 0xbf,0) == '\0') &&
                  (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar7[0x1f]) {
                auVar132 = ZEXT3264(local_6e0);
                goto LAB_01676305;
              }
              local_220 = vandps_avx(auVar129,auVar152);
              auVar131._8_4_ = 0xbf800000;
              auVar131._0_8_ = 0xbf800000bf800000;
              auVar131._12_4_ = 0xbf800000;
              auVar131._16_4_ = 0xbf800000;
              auVar131._20_4_ = 0xbf800000;
              auVar131._24_4_ = 0xbf800000;
              auVar131._28_4_ = 0xbf800000;
              auVar147._8_4_ = 0x40000000;
              auVar147._0_8_ = 0x4000000040000000;
              auVar147._12_4_ = 0x40000000;
              auVar147._16_4_ = 0x40000000;
              auVar147._20_4_ = 0x40000000;
              auVar147._24_4_ = 0x40000000;
              auVar147._28_4_ = 0x40000000;
              auVar148 = ZEXT3264(auVar147);
              auVar14 = vfmadd213ps_fma(local_360,auVar147,auVar131);
              local_2e0 = _local_180;
              local_2c0 = ZEXT1632(auVar14);
              local_2a0 = local_1a0;
              local_270 = local_710;
              uStack_268 = uStack_708;
              local_260 = local_4b0._0_8_;
              uStack_258 = local_4b0._8_8_;
              local_250 = local_4c0._0_8_;
              uStack_248 = local_4c0._8_8_;
              local_240 = local_4d0;
              pGVar11 = (context->scene->geometries).items[local_788].ptr;
              local_360 = local_2c0;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                auVar82._28_4_ = 0;
                auVar82._0_28_ = _auStack_83c;
                _local_840 = auVar82 << 0x20;
                auVar132 = ZEXT3264(local_6e0);
              }
              else {
                auVar132 = ZEXT3264(local_6e0);
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (local_840 = (undefined1  [4])0x1,
                   pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_5e0 = ZEXT1632(CONCAT88(auVar159._8_8_,pGVar11));
                  fVar135 = (float)local_280;
                  auVar148 = ZEXT3264(CONCAT428(fVar135,CONCAT424(fVar135,CONCAT420(fVar135,
                                                  CONCAT416(fVar135,CONCAT412(fVar135,CONCAT48(
                                                  fVar135,CONCAT44(fVar135,fVar135))))))));
                  local_200[0] = (fVar135 + (float)local_180._0_4_ + 0.0) * local_120;
                  local_200[1] = (fVar135 + (float)local_180._4_4_ + 1.0) * fStack_11c;
                  local_200[2] = (fVar135 + fStack_178 + 2.0) * fStack_118;
                  local_200[3] = (fVar135 + fStack_174 + 3.0) * fStack_114;
                  fStack_1f0 = (fVar135 + fStack_170 + 4.0) * fStack_110;
                  fStack_1ec = (fVar135 + fStack_16c + 5.0) * fStack_10c;
                  fStack_1e8 = (fVar135 + fStack_168 + 6.0) * fStack_108;
                  fStack_1e4 = fVar135 + fStack_164 + 7.0;
                  local_360._0_8_ = auVar14._0_8_;
                  local_360._8_8_ = auVar14._8_8_;
                  local_1e0 = local_360._0_8_;
                  uStack_1d8 = local_360._8_8_;
                  uStack_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1c0 = local_1a0;
                  uVar86 = vmovmskps_avx(local_220);
                  uVar88 = (uint)CONCAT71(139999,uVar86 != 0);
                  local_840 = (undefined1  [4])uVar88;
                  if (uVar86 != 0) {
                    lVar23 = 0;
                    local_7c0 = (ulong)(uVar86 & 0xff);
                    for (uVar84 = local_7c0; (uVar84 & 1) == 0;
                        uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    local_800 = ZEXT1632(CONCAT88(auVar16._8_8_,lVar23));
                    local_500 = ZEXT1632(local_4b0);
                    local_520._16_16_ = auVar19._16_16_;
                    local_520._0_16_ = local_4c0;
                    _local_560 = ZEXT1632(local_4d0);
                    auStack_530 = auVar20._16_16_;
                    local_540 = *local_640;
                    local_27c = iVar10;
                    do {
                      local_5c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar135 = local_200[local_800._0_8_];
                      local_3c0._4_4_ = fVar135;
                      local_3c0._0_4_ = fVar135;
                      local_3c0._8_4_ = fVar135;
                      local_3c0._12_4_ = fVar135;
                      local_3b0 = *(undefined4 *)((long)&local_1e0 + local_800._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_1c0 + local_800._0_8_ * 4);
                      fVar110 = 1.0 - fVar135;
                      auVar159 = ZEXT416((uint)(fVar135 * fVar110 * 4.0));
                      auVar14 = vfnmsub213ss_fma(local_3c0,local_3c0,auVar159);
                      auVar159 = vfmadd213ss_fma(ZEXT416((uint)fVar110),ZEXT416((uint)fVar110),
                                                 auVar159);
                      auVar174 = ZEXT464(0x3f000000);
                      fVar108 = auVar159._0_4_ * 0.5;
                      fVar135 = fVar135 * fVar135 * 0.5;
                      auVar160._0_4_ = fVar135 * (float)local_560._0_4_;
                      auVar160._4_4_ = fVar135 * (float)local_560._4_4_;
                      auVar160._8_4_ = fVar135 * fStack_558;
                      auVar160._12_4_ = fVar135 * fStack_554;
                      auVar140._4_4_ = fVar108;
                      auVar140._0_4_ = fVar108;
                      auVar140._8_4_ = fVar108;
                      auVar140._12_4_ = fVar108;
                      auVar159 = vfmadd132ps_fma(auVar140,auVar160,local_520._0_16_);
                      fVar135 = auVar14._0_4_ * 0.5;
                      auVar161._4_4_ = fVar135;
                      auVar161._0_4_ = fVar135;
                      auVar161._8_4_ = fVar135;
                      auVar161._12_4_ = fVar135;
                      auVar159 = vfmadd132ps_fma(auVar161,auVar159,local_500._0_16_);
                      local_630.context = context->user;
                      fVar135 = fVar110 * -fVar110 * 0.5;
                      auVar141._4_4_ = fVar135;
                      auVar141._0_4_ = fVar135;
                      auVar141._8_4_ = fVar135;
                      auVar141._12_4_ = fVar135;
                      auVar79._8_8_ = uStack_708;
                      auVar79._0_8_ = local_710;
                      auVar159 = vfmadd132ps_fma(auVar141,auVar159,auVar79);
                      local_3f0 = auVar159._0_4_;
                      local_3e0 = vshufps_avx(auVar159,auVar159,0x55);
                      local_3d0 = vshufps_avx(auVar159,auVar159,0xaa);
                      auVar148 = ZEXT1664(local_3d0);
                      local_3a0 = CONCAT44(uStack_57c,local_580);
                      uStack_398 = CONCAT44(uStack_574,uStack_578);
                      local_390 = _local_570;
                      vpcmpeqd_avx2(ZEXT1632(_local_570),ZEXT1632(_local_570));
                      uStack_37c = (local_630.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_630.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_7a0 = local_540._0_8_;
                      uStack_798 = local_540._8_8_;
                      local_630.valid = (int *)&local_7a0;
                      local_630.geometryUserPtr = *(void **)(local_5e0._0_8_ + 0x18);
                      local_630.hit = (RTCHitN *)&local_3f0;
                      local_630.N = 4;
                      local_630.ray = (RTCRayN *)ray;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      if (*(code **)(local_5e0._0_8_ + 0x48) != (code *)0x0) {
                        auVar148 = ZEXT1664(local_3d0);
                        auVar174 = ZEXT1664(auVar174._0_16_);
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (**(code **)(local_5e0._0_8_ + 0x48))(&local_630);
                      }
                      auVar76._8_8_ = uStack_798;
                      auVar76._0_8_ = local_7a0;
                      if (auVar76 == (undefined1  [16])0x0) {
                        auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar159 = auVar159 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_5e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar174 = ZEXT1664(auVar174._0_16_);
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          (*p_Var13)(&local_630);
                        }
                        auVar77._8_8_ = uStack_798;
                        auVar77._0_8_ = local_7a0;
                        auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,auVar77);
                        auVar159 = auVar14 ^ _DAT_01febe20;
                        auVar142._8_4_ = 0xff800000;
                        auVar142._0_8_ = 0xff800000ff800000;
                        auVar142._12_4_ = 0xff800000;
                        auVar148 = ZEXT1664(auVar142);
                        auVar14 = vblendvps_avx(auVar142,*(undefined1 (*) [16])
                                                          (local_630.ray + 0x80),auVar14);
                        *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar14;
                      }
                      auVar122._8_8_ = 0x100000001;
                      auVar122._0_8_ = 0x100000001;
                      if ((auVar122 & auVar159) != (undefined1  [16])0x0) break;
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
                      lVar23 = 0;
                      local_7c0 = local_7c0 ^ 1L << (local_800._0_8_ & 0x3f);
                      for (uVar84 = local_7c0; (uVar84 & 1) == 0;
                          uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                        lVar23 = lVar23 + 1;
                      }
                      local_800._0_8_ = lVar23;
                      local_840 = (undefined1  [4])(uint)(local_7c0 != 0);
                    } while (local_7c0 != 0);
                  }
                  auVar202 = ZEXT3264(local_700);
                  auVar132 = ZEXT3264(local_6e0);
                  auVar215 = ZEXT3264(local_6c0);
                  auVar192 = ZEXT3264(local_5a0);
                  auVar179 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar194 = ZEXT3264(local_760);
                  auVar216 = ZEXT3264(local_780);
                }
              }
              pRVar85 = (RTCIntersectArguments *)
                        (ulong)CONCAT31(local_6a0._1_3_,local_6a0[0] | local_840[0]);
            }
            fVar149 = (float)local_740;
            fVar153 = local_740._4_4_;
            fVar108 = (float)uStack_738;
            fVar110 = uStack_738._4_4_;
            fVar112 = (float)uStack_730;
            fVar195 = uStack_730._4_4_;
            fVar196 = (float)uStack_728;
          }
LAB_01676305:
          lVar90 = lVar90 + 8;
        } while ((int)lVar90 < iVar10);
      }
      if (((ulong)pRVar85 & 1) != 0) {
        return bVar92;
      }
      uVar93 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar99._4_4_ = uVar93;
      auVar99._0_4_ = uVar93;
      auVar99._8_4_ = uVar93;
      auVar99._12_4_ = uVar93;
      auVar159 = vcmpps_avx(local_300,auVar99,2);
      uVar86 = vmovmskps_avx(auVar159);
      uVar86 = (uint)uVar91 & uVar86;
      bVar92 = uVar86 != 0;
    } while (bVar92);
  }
  return bVar92;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }